

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::sse2::CurveNiIntersectorK<4,4>::
     intersect_hn<embree::sse2::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::sse2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  Primitive *pPVar4;
  Primitive PVar5;
  undefined4 uVar6;
  Geometry *pGVar7;
  long lVar8;
  __int_type_conflict _Var9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined3 uVar22;
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined8 uVar26;
  uint uVar27;
  undefined6 uVar28;
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  int iVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  bool bVar47;
  bool bVar48;
  byte bVar49;
  ulong uVar50;
  ulong uVar51;
  RTCFilterFunctionN p_Var52;
  RTCRayN *pRVar53;
  undefined4 uVar54;
  undefined8 unaff_R14;
  bool bVar55;
  uint uVar56;
  int iVar57;
  uint uVar58;
  int iVar59;
  uint uVar60;
  uint uVar61;
  float fVar62;
  float fVar90;
  float fVar91;
  vfloat_impl<4> p00;
  undefined1 auVar63 [16];
  undefined2 uVar89;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar68 [16];
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  short sVar92;
  float fVar93;
  float fVar127;
  float fVar128;
  undefined1 auVar94 [16];
  undefined1 auVar97 [16];
  undefined1 auVar100 [16];
  undefined1 auVar103 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float t1;
  float fVar129;
  float fVar140;
  float fVar141;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar142;
  float fVar143;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar144;
  float fVar149;
  float fVar150;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar151;
  float fVar164;
  float fVar165;
  vfloat4 v;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar166;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar167;
  float fVar168;
  float fVar182;
  float fVar184;
  vfloat4 a;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar183;
  float fVar185;
  float fVar186;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar187;
  float fVar188;
  float fVar204;
  float fVar206;
  undefined1 auVar189 [16];
  undefined1 auVar192 [16];
  undefined1 auVar195 [16];
  undefined1 auVar198 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar205;
  float fVar207;
  float fVar208;
  undefined1 auVar203 [16];
  float fVar209;
  float fVar218;
  float fVar220;
  undefined1 auVar210 [16];
  float fVar219;
  float fVar221;
  float fVar222;
  float fVar223;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar224;
  float fVar225;
  float fVar235;
  float fVar237;
  undefined1 auVar226 [16];
  float fVar236;
  float fVar238;
  float fVar239;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  float fVar240;
  float fVar252;
  float fVar255;
  undefined1 auVar244 [16];
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar253;
  float fVar254;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar261;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  float fVar262;
  float fVar263;
  float fVar264;
  float fVar270;
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar288;
  float fVar293;
  vfloat4 a_1;
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar292;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar301;
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar313;
  float fVar317;
  undefined1 auVar306 [16];
  float fVar321;
  undefined1 auVar309 [16];
  float fVar314;
  float fVar315;
  float fVar316;
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar322;
  float fVar323;
  float fVar324;
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar332;
  float fVar334;
  float fVar336;
  undefined1 auVar328 [16];
  float fVar333;
  float fVar335;
  float fVar337;
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  float fVar338;
  float fVar339;
  float fVar343;
  float fVar344;
  float fVar345;
  float fVar346;
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  float fVar347;
  float fVar348;
  float fVar349;
  float fVar351;
  float fVar352;
  float fVar353;
  float fVar354;
  float fVar355;
  float fVar356;
  undefined1 auVar350 [16];
  undefined1 local_538 [8];
  float fStack_530;
  float fStack_52c;
  BBox1f local_518;
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  undefined1 local_418 [16];
  undefined1 (*local_408) [16];
  Primitive *local_400;
  ulong local_3f8;
  ulong local_3f0;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  BBox1f cv_stack [4];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 uVar126;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  
  PVar5 = prim[1];
  uVar50 = (ulong)(byte)PVar5;
  pPVar4 = prim + uVar50 * 0x19 + 6;
  fVar150 = *(float *)(pPVar4 + 0xc);
  uVar54 = *(undefined4 *)(ray + k * 4 + 0x30);
  fVar151 = (*(float *)(ray + k * 4) - *(float *)pPVar4) * fVar150;
  fVar164 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar4 + 4)) * fVar150;
  fVar165 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar4 + 8)) * fVar150;
  fVar144 = *(float *)(ray + k * 4 + 0x40) * fVar150;
  fVar149 = *(float *)(ray + k * 4 + 0x50) * fVar150;
  fVar150 = *(float *)(ray + k * 4 + 0x60) * fVar150;
  uVar6 = *(undefined4 *)(prim + uVar50 * 4 + 6);
  uVar126 = (undefined1)((uint)uVar6 >> 0x18);
  uVar89 = CONCAT11(uVar126,uVar126);
  uVar126 = (undefined1)((uint)uVar6 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar89,uVar126),CONCAT14(uVar126,uVar6));
  uVar126 = (undefined1)((uint)uVar6 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar126),uVar126);
  sVar92 = CONCAT11((char)uVar6,(char)uVar6);
  uVar51 = CONCAT62(uVar28,sVar92);
  auVar96._8_4_ = 0;
  auVar96._0_8_ = uVar51;
  auVar96._12_2_ = uVar89;
  auVar96._14_2_ = uVar89;
  uVar89 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar95._12_4_ = auVar96._12_4_;
  auVar95._8_2_ = 0;
  auVar95._0_8_ = uVar51;
  auVar95._10_2_ = uVar89;
  auVar94._10_6_ = auVar95._10_6_;
  auVar94._8_2_ = uVar89;
  auVar94._0_8_ = uVar51;
  uVar89 = (undefined2)uVar28;
  auVar29._4_8_ = auVar94._8_8_;
  auVar29._2_2_ = uVar89;
  auVar29._0_2_ = uVar89;
  fVar129 = (float)((int)sVar92 >> 8);
  fVar140 = (float)(auVar29._0_4_ >> 0x18);
  fVar141 = (float)(auVar94._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar50 * 5 + 6);
  uVar126 = (undefined1)((uint)uVar6 >> 0x18);
  uVar89 = CONCAT11(uVar126,uVar126);
  uVar126 = (undefined1)((uint)uVar6 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar89,uVar126),CONCAT14(uVar126,uVar6));
  uVar126 = (undefined1)((uint)uVar6 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar126),uVar126);
  sVar92 = CONCAT11((char)uVar6,(char)uVar6);
  uVar51 = CONCAT62(uVar28,sVar92);
  auVar99._8_4_ = 0;
  auVar99._0_8_ = uVar51;
  auVar99._12_2_ = uVar89;
  auVar99._14_2_ = uVar89;
  uVar89 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar98._12_4_ = auVar99._12_4_;
  auVar98._8_2_ = 0;
  auVar98._0_8_ = uVar51;
  auVar98._10_2_ = uVar89;
  auVar97._10_6_ = auVar98._10_6_;
  auVar97._8_2_ = uVar89;
  auVar97._0_8_ = uVar51;
  uVar89 = (undefined2)uVar28;
  auVar30._4_8_ = auVar97._8_8_;
  auVar30._2_2_ = uVar89;
  auVar30._0_2_ = uVar89;
  fVar167 = (float)((int)sVar92 >> 8);
  fVar182 = (float)(auVar30._0_4_ >> 0x18);
  fVar184 = (float)(auVar97._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar50 * 6 + 6);
  uVar126 = (undefined1)((uint)uVar6 >> 0x18);
  uVar89 = CONCAT11(uVar126,uVar126);
  uVar126 = (undefined1)((uint)uVar6 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar89,uVar126),CONCAT14(uVar126,uVar6));
  uVar126 = (undefined1)((uint)uVar6 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar126),uVar126);
  sVar92 = CONCAT11((char)uVar6,(char)uVar6);
  uVar51 = CONCAT62(uVar28,sVar92);
  auVar102._8_4_ = 0;
  auVar102._0_8_ = uVar51;
  auVar102._12_2_ = uVar89;
  auVar102._14_2_ = uVar89;
  uVar89 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar101._12_4_ = auVar102._12_4_;
  auVar101._8_2_ = 0;
  auVar101._0_8_ = uVar51;
  auVar101._10_2_ = uVar89;
  auVar100._10_6_ = auVar101._10_6_;
  auVar100._8_2_ = uVar89;
  auVar100._0_8_ = uVar51;
  uVar89 = (undefined2)uVar28;
  auVar31._4_8_ = auVar100._8_8_;
  auVar31._2_2_ = uVar89;
  auVar31._0_2_ = uVar89;
  fVar224 = (float)((int)sVar92 >> 8);
  fVar235 = (float)(auVar31._0_4_ >> 0x18);
  fVar237 = (float)(auVar100._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar50 * 0xb + 6);
  uVar126 = (undefined1)((uint)uVar6 >> 0x18);
  uVar89 = CONCAT11(uVar126,uVar126);
  uVar126 = (undefined1)((uint)uVar6 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar89,uVar126),CONCAT14(uVar126,uVar6));
  uVar126 = (undefined1)((uint)uVar6 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar126),uVar126);
  sVar92 = CONCAT11((char)uVar6,(char)uVar6);
  uVar51 = CONCAT62(uVar28,sVar92);
  auVar105._8_4_ = 0;
  auVar105._0_8_ = uVar51;
  auVar105._12_2_ = uVar89;
  auVar105._14_2_ = uVar89;
  uVar89 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar104._12_4_ = auVar105._12_4_;
  auVar104._8_2_ = 0;
  auVar104._0_8_ = uVar51;
  auVar104._10_2_ = uVar89;
  auVar103._10_6_ = auVar104._10_6_;
  auVar103._8_2_ = uVar89;
  auVar103._0_8_ = uVar51;
  uVar89 = (undefined2)uVar28;
  auVar32._4_8_ = auVar103._8_8_;
  auVar32._2_2_ = uVar89;
  auVar32._0_2_ = uVar89;
  fVar62 = (float)((int)sVar92 >> 8);
  fVar90 = (float)(auVar32._0_4_ >> 0x18);
  fVar91 = (float)(auVar103._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar50 * 0xc + 6);
  uVar126 = (undefined1)((uint)uVar6 >> 0x18);
  uVar89 = CONCAT11(uVar126,uVar126);
  uVar126 = (undefined1)((uint)uVar6 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar89,uVar126),CONCAT14(uVar126,uVar6));
  uVar126 = (undefined1)((uint)uVar6 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar126),uVar126);
  sVar92 = CONCAT11((char)uVar6,(char)uVar6);
  uVar51 = CONCAT62(uVar28,sVar92);
  auVar191._8_4_ = 0;
  auVar191._0_8_ = uVar51;
  auVar191._12_2_ = uVar89;
  auVar191._14_2_ = uVar89;
  uVar89 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar190._12_4_ = auVar191._12_4_;
  auVar190._8_2_ = 0;
  auVar190._0_8_ = uVar51;
  auVar190._10_2_ = uVar89;
  auVar189._10_6_ = auVar190._10_6_;
  auVar189._8_2_ = uVar89;
  auVar189._0_8_ = uVar51;
  uVar89 = (undefined2)uVar28;
  auVar33._4_8_ = auVar189._8_8_;
  auVar33._2_2_ = uVar89;
  auVar33._0_2_ = uVar89;
  fVar209 = (float)((int)sVar92 >> 8);
  fVar218 = (float)(auVar33._0_4_ >> 0x18);
  fVar220 = (float)(auVar189._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar50 * 0xd + 6);
  uVar126 = (undefined1)((uint)uVar6 >> 0x18);
  uVar89 = CONCAT11(uVar126,uVar126);
  uVar126 = (undefined1)((uint)uVar6 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar89,uVar126),CONCAT14(uVar126,uVar6));
  uVar126 = (undefined1)((uint)uVar6 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar126),uVar126);
  sVar92 = CONCAT11((char)uVar6,(char)uVar6);
  uVar51 = CONCAT62(uVar28,sVar92);
  auVar194._8_4_ = 0;
  auVar194._0_8_ = uVar51;
  auVar194._12_2_ = uVar89;
  auVar194._14_2_ = uVar89;
  uVar89 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar193._12_4_ = auVar194._12_4_;
  auVar193._8_2_ = 0;
  auVar193._0_8_ = uVar51;
  auVar193._10_2_ = uVar89;
  auVar192._10_6_ = auVar193._10_6_;
  auVar192._8_2_ = uVar89;
  auVar192._0_8_ = uVar51;
  uVar89 = (undefined2)uVar28;
  auVar34._4_8_ = auVar192._8_8_;
  auVar34._2_2_ = uVar89;
  auVar34._0_2_ = uVar89;
  fVar262 = (float)((int)sVar92 >> 8);
  fVar270 = (float)(auVar34._0_4_ >> 0x18);
  fVar273 = (float)(auVar192._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar50 * 0x12 + 6);
  uVar126 = (undefined1)((uint)uVar6 >> 0x18);
  uVar89 = CONCAT11(uVar126,uVar126);
  uVar126 = (undefined1)((uint)uVar6 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar89,uVar126),CONCAT14(uVar126,uVar6));
  uVar126 = (undefined1)((uint)uVar6 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar126),uVar126);
  sVar92 = CONCAT11((char)uVar6,(char)uVar6);
  uVar51 = CONCAT62(uVar28,sVar92);
  auVar197._8_4_ = 0;
  auVar197._0_8_ = uVar51;
  auVar197._12_2_ = uVar89;
  auVar197._14_2_ = uVar89;
  uVar89 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar196._12_4_ = auVar197._12_4_;
  auVar196._8_2_ = 0;
  auVar196._0_8_ = uVar51;
  auVar196._10_2_ = uVar89;
  auVar195._10_6_ = auVar196._10_6_;
  auVar195._8_2_ = uVar89;
  auVar195._0_8_ = uVar51;
  uVar89 = (undefined2)uVar28;
  auVar35._4_8_ = auVar195._8_8_;
  auVar35._2_2_ = uVar89;
  auVar35._0_2_ = uVar89;
  fVar240 = (float)((int)sVar92 >> 8);
  fVar252 = (float)(auVar35._0_4_ >> 0x18);
  fVar255 = (float)(auVar195._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar50 * 0x13 + 6);
  uVar126 = (undefined1)((uint)uVar6 >> 0x18);
  uVar89 = CONCAT11(uVar126,uVar126);
  uVar126 = (undefined1)((uint)uVar6 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar89,uVar126),CONCAT14(uVar126,uVar6));
  uVar126 = (undefined1)((uint)uVar6 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar126),uVar126);
  sVar92 = CONCAT11((char)uVar6,(char)uVar6);
  uVar51 = CONCAT62(uVar28,sVar92);
  auVar200._8_4_ = 0;
  auVar200._0_8_ = uVar51;
  auVar200._12_2_ = uVar89;
  auVar200._14_2_ = uVar89;
  uVar89 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar199._12_4_ = auVar200._12_4_;
  auVar199._8_2_ = 0;
  auVar199._0_8_ = uVar51;
  auVar199._10_2_ = uVar89;
  auVar198._10_6_ = auVar199._10_6_;
  auVar198._8_2_ = uVar89;
  auVar198._0_8_ = uVar51;
  uVar89 = (undefined2)uVar28;
  auVar36._4_8_ = auVar198._8_8_;
  auVar36._2_2_ = uVar89;
  auVar36._0_2_ = uVar89;
  fVar280 = (float)((int)sVar92 >> 8);
  fVar288 = (float)(auVar36._0_4_ >> 0x18);
  fVar293 = (float)(auVar198._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar50 * 0x14 + 6);
  uVar126 = (undefined1)((uint)uVar6 >> 0x18);
  uVar89 = CONCAT11(uVar126,uVar126);
  uVar126 = (undefined1)((uint)uVar6 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar89,uVar126),CONCAT14(uVar126,uVar6));
  uVar126 = (undefined1)((uint)uVar6 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar126),uVar126);
  sVar92 = CONCAT11((char)uVar6,(char)uVar6);
  uVar51 = CONCAT62(uVar28,sVar92);
  auVar308._8_4_ = 0;
  auVar308._0_8_ = uVar51;
  auVar308._12_2_ = uVar89;
  auVar308._14_2_ = uVar89;
  uVar89 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar307._12_4_ = auVar308._12_4_;
  auVar307._8_2_ = 0;
  auVar307._0_8_ = uVar51;
  auVar307._10_2_ = uVar89;
  auVar306._10_6_ = auVar307._10_6_;
  auVar306._8_2_ = uVar89;
  auVar306._0_8_ = uVar51;
  uVar89 = (undefined2)uVar28;
  auVar37._4_8_ = auVar306._8_8_;
  auVar37._2_2_ = uVar89;
  auVar37._0_2_ = uVar89;
  fVar93 = (float)((int)sVar92 >> 8);
  fVar127 = (float)(auVar37._0_4_ >> 0x18);
  fVar128 = (float)(auVar306._8_4_ >> 0x18);
  fVar325 = fVar144 * fVar129 + fVar149 * fVar167 + fVar150 * fVar224;
  fVar332 = fVar144 * fVar140 + fVar149 * fVar182 + fVar150 * fVar235;
  fVar334 = fVar144 * fVar141 + fVar149 * fVar184 + fVar150 * fVar237;
  fVar336 = fVar144 * (float)(auVar95._12_4_ >> 0x18) +
            fVar149 * (float)(auVar98._12_4_ >> 0x18) + fVar150 * (float)(auVar101._12_4_ >> 0x18);
  fVar302 = fVar144 * fVar62 + fVar149 * fVar209 + fVar150 * fVar262;
  fVar313 = fVar144 * fVar90 + fVar149 * fVar218 + fVar150 * fVar270;
  fVar317 = fVar144 * fVar91 + fVar149 * fVar220 + fVar150 * fVar273;
  fVar321 = fVar144 * (float)(auVar104._12_4_ >> 0x18) +
            fVar149 * (float)(auVar190._12_4_ >> 0x18) + fVar150 * (float)(auVar193._12_4_ >> 0x18);
  fVar187 = fVar144 * fVar240 + fVar149 * fVar280 + fVar150 * fVar93;
  fVar204 = fVar144 * fVar252 + fVar149 * fVar288 + fVar150 * fVar127;
  fVar206 = fVar144 * fVar255 + fVar149 * fVar293 + fVar150 * fVar128;
  fVar144 = fVar144 * (float)(auVar196._12_4_ >> 0x18) +
            fVar149 * (float)(auVar199._12_4_ >> 0x18) + fVar150 * (float)(auVar307._12_4_ >> 0x18);
  fVar167 = fVar129 * fVar151 + fVar167 * fVar164 + fVar224 * fVar165;
  fVar182 = fVar140 * fVar151 + fVar182 * fVar164 + fVar235 * fVar165;
  fVar184 = fVar141 * fVar151 + fVar184 * fVar164 + fVar237 * fVar165;
  fVar224 = (float)(auVar95._12_4_ >> 0x18) * fVar151 +
            (float)(auVar98._12_4_ >> 0x18) * fVar164 + (float)(auVar101._12_4_ >> 0x18) * fVar165;
  fVar235 = fVar62 * fVar151 + fVar209 * fVar164 + fVar262 * fVar165;
  fVar237 = fVar90 * fVar151 + fVar218 * fVar164 + fVar270 * fVar165;
  fVar262 = fVar91 * fVar151 + fVar220 * fVar164 + fVar273 * fVar165;
  fVar270 = (float)(auVar104._12_4_ >> 0x18) * fVar151 +
            (float)(auVar190._12_4_ >> 0x18) * fVar164 + (float)(auVar193._12_4_ >> 0x18) * fVar165;
  fVar209 = fVar151 * fVar240 + fVar164 * fVar280 + fVar165 * fVar93;
  fVar218 = fVar151 * fVar252 + fVar164 * fVar288 + fVar165 * fVar127;
  fVar220 = fVar151 * fVar255 + fVar164 * fVar293 + fVar165 * fVar128;
  fVar151 = fVar151 * (float)(auVar196._12_4_ >> 0x18) +
            fVar164 * (float)(auVar199._12_4_ >> 0x18) + fVar165 * (float)(auVar307._12_4_ >> 0x18);
  fVar150 = (float)DAT_01f4bd50;
  fVar62 = DAT_01f4bd50._4_4_;
  fVar90 = DAT_01f4bd50._8_4_;
  fVar91 = DAT_01f4bd50._12_4_;
  uVar56 = -(uint)(fVar150 <= ABS(fVar325));
  uVar58 = -(uint)(fVar62 <= ABS(fVar332));
  uVar60 = -(uint)(fVar90 <= ABS(fVar334));
  uVar61 = -(uint)(fVar91 <= ABS(fVar336));
  auVar328._0_4_ = (uint)fVar325 & uVar56;
  auVar328._4_4_ = (uint)fVar332 & uVar58;
  auVar328._8_4_ = (uint)fVar334 & uVar60;
  auVar328._12_4_ = (uint)fVar336 & uVar61;
  auVar152._0_4_ = ~uVar56 & (uint)fVar150;
  auVar152._4_4_ = ~uVar58 & (uint)fVar62;
  auVar152._8_4_ = ~uVar60 & (uint)fVar90;
  auVar152._12_4_ = ~uVar61 & (uint)fVar91;
  auVar152 = auVar152 | auVar328;
  uVar56 = -(uint)(fVar150 <= ABS(fVar302));
  uVar58 = -(uint)(fVar62 <= ABS(fVar313));
  uVar60 = -(uint)(fVar90 <= ABS(fVar317));
  uVar61 = -(uint)(fVar91 <= ABS(fVar321));
  auVar309._0_4_ = (uint)fVar302 & uVar56;
  auVar309._4_4_ = (uint)fVar313 & uVar58;
  auVar309._8_4_ = (uint)fVar317 & uVar60;
  auVar309._12_4_ = (uint)fVar321 & uVar61;
  auVar169._0_4_ = ~uVar56 & (uint)fVar150;
  auVar169._4_4_ = ~uVar58 & (uint)fVar62;
  auVar169._8_4_ = ~uVar60 & (uint)fVar90;
  auVar169._12_4_ = ~uVar61 & (uint)fVar91;
  auVar169 = auVar169 | auVar309;
  uVar56 = -(uint)(fVar150 <= ABS(fVar187));
  uVar58 = -(uint)(fVar62 <= ABS(fVar204));
  uVar60 = -(uint)(fVar90 <= ABS(fVar206));
  uVar61 = -(uint)(fVar91 <= ABS(fVar144));
  auVar201._0_4_ = (uint)fVar187 & uVar56;
  auVar201._4_4_ = (uint)fVar204 & uVar58;
  auVar201._8_4_ = (uint)fVar206 & uVar60;
  auVar201._12_4_ = (uint)fVar144 & uVar61;
  auVar244._0_4_ = ~uVar56 & (uint)fVar150;
  auVar244._4_4_ = ~uVar58 & (uint)fVar62;
  auVar244._8_4_ = ~uVar60 & (uint)fVar90;
  auVar244._12_4_ = ~uVar61 & (uint)fVar91;
  auVar244 = auVar244 | auVar201;
  auVar63 = rcpps(_DAT_01f4bd50,auVar152);
  fVar150 = auVar63._0_4_;
  fVar91 = auVar63._4_4_;
  fVar128 = auVar63._8_4_;
  fVar141 = auVar63._12_4_;
  fVar150 = (1.0 - auVar152._0_4_ * fVar150) * fVar150 + fVar150;
  fVar91 = (1.0 - auVar152._4_4_ * fVar91) * fVar91 + fVar91;
  fVar128 = (1.0 - auVar152._8_4_ * fVar128) * fVar128 + fVar128;
  fVar141 = (1.0 - auVar152._12_4_ * fVar141) * fVar141 + fVar141;
  auVar63 = rcpps(auVar63,auVar169);
  fVar62 = auVar63._0_4_;
  fVar93 = auVar63._4_4_;
  fVar129 = auVar63._8_4_;
  fVar144 = auVar63._12_4_;
  fVar62 = (1.0 - auVar169._0_4_ * fVar62) * fVar62 + fVar62;
  fVar93 = (1.0 - auVar169._4_4_ * fVar93) * fVar93 + fVar93;
  fVar129 = (1.0 - auVar169._8_4_ * fVar129) * fVar129 + fVar129;
  fVar144 = (1.0 - auVar169._12_4_ * fVar144) * fVar144 + fVar144;
  auVar63 = rcpps(auVar63,auVar244);
  fVar90 = auVar63._0_4_;
  fVar127 = auVar63._4_4_;
  fVar140 = auVar63._8_4_;
  fVar149 = auVar63._12_4_;
  fVar90 = (1.0 - auVar244._0_4_ * fVar90) * fVar90 + fVar90;
  fVar127 = (1.0 - auVar244._4_4_ * fVar127) * fVar127 + fVar127;
  fVar140 = (1.0 - auVar244._8_4_ * fVar140) * fVar140 + fVar140;
  fVar149 = (1.0 - auVar244._12_4_ * fVar149) * fVar149 + fVar149;
  uVar51 = *(ulong *)(prim + uVar50 * 7 + 6);
  uVar89 = (undefined2)(uVar51 >> 0x30);
  auVar63._8_4_ = 0;
  auVar63._0_8_ = uVar51;
  auVar63._12_2_ = uVar89;
  auVar63._14_2_ = uVar89;
  uVar89 = (undefined2)(uVar51 >> 0x20);
  auVar110._12_4_ = auVar63._12_4_;
  auVar110._8_2_ = 0;
  auVar110._0_8_ = uVar51;
  auVar110._10_2_ = uVar89;
  auVar146._10_6_ = auVar110._10_6_;
  auVar146._8_2_ = uVar89;
  auVar146._0_8_ = uVar51;
  uVar89 = (undefined2)(uVar51 >> 0x10);
  auVar38._4_8_ = auVar146._8_8_;
  auVar38._2_2_ = uVar89;
  auVar38._0_2_ = uVar89;
  auVar153._0_8_ =
       CONCAT44(((float)(auVar38._0_4_ >> 0x10) - fVar182) * fVar91,
                ((float)(int)(short)uVar51 - fVar167) * fVar150);
  auVar153._8_4_ = ((float)(auVar146._8_4_ >> 0x10) - fVar184) * fVar128;
  auVar153._12_4_ = ((float)(auVar110._12_4_ >> 0x10) - fVar224) * fVar141;
  uVar51 = *(ulong *)(prim + uVar50 * 9 + 6);
  uVar89 = (undefined2)(uVar51 >> 0x30);
  auVar133._8_4_ = 0;
  auVar133._0_8_ = uVar51;
  auVar133._12_2_ = uVar89;
  auVar133._14_2_ = uVar89;
  uVar89 = (undefined2)(uVar51 >> 0x20);
  auVar246._12_4_ = auVar133._12_4_;
  auVar246._8_2_ = 0;
  auVar246._0_8_ = uVar51;
  auVar246._10_2_ = uVar89;
  auVar64._10_6_ = auVar246._10_6_;
  auVar64._8_2_ = uVar89;
  auVar64._0_8_ = uVar51;
  uVar89 = (undefined2)(uVar51 >> 0x10);
  auVar39._4_8_ = auVar64._8_8_;
  auVar39._2_2_ = uVar89;
  auVar39._0_2_ = uVar89;
  auVar170._0_4_ = ((float)(int)(short)uVar51 - fVar167) * fVar150;
  auVar170._4_4_ = ((float)(auVar39._0_4_ >> 0x10) - fVar182) * fVar91;
  auVar170._8_4_ = ((float)(auVar64._8_4_ >> 0x10) - fVar184) * fVar128;
  auVar170._12_4_ = ((float)(auVar246._12_4_ >> 0x10) - fVar224) * fVar141;
  uVar51 = *(ulong *)(prim + uVar50 * 0xe + 6);
  uVar89 = (undefined2)(uVar51 >> 0x30);
  auVar67._8_4_ = 0;
  auVar67._0_8_ = uVar51;
  auVar67._12_2_ = uVar89;
  auVar67._14_2_ = uVar89;
  uVar89 = (undefined2)(uVar51 >> 0x20);
  auVar66._12_4_ = auVar67._12_4_;
  auVar66._8_2_ = 0;
  auVar66._0_8_ = uVar51;
  auVar66._10_2_ = uVar89;
  auVar65._10_6_ = auVar66._10_6_;
  auVar65._8_2_ = uVar89;
  auVar65._0_8_ = uVar51;
  uVar89 = (undefined2)(uVar51 >> 0x10);
  auVar40._4_8_ = auVar65._8_8_;
  auVar40._2_2_ = uVar89;
  auVar40._0_2_ = uVar89;
  auVar130._0_8_ =
       CONCAT44(((float)(auVar40._0_4_ >> 0x10) - fVar237) * fVar93,
                ((float)(int)(short)uVar51 - fVar235) * fVar62);
  auVar130._8_4_ = ((float)(auVar65._8_4_ >> 0x10) - fVar262) * fVar129;
  auVar130._12_4_ = ((float)(auVar66._12_4_ >> 0x10) - fVar270) * fVar144;
  uVar51 = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  uVar89 = (undefined2)(uVar51 >> 0x30);
  auVar70._8_4_ = 0;
  auVar70._0_8_ = uVar51;
  auVar70._12_2_ = uVar89;
  auVar70._14_2_ = uVar89;
  uVar89 = (undefined2)(uVar51 >> 0x20);
  auVar69._12_4_ = auVar70._12_4_;
  auVar69._8_2_ = 0;
  auVar69._0_8_ = uVar51;
  auVar69._10_2_ = uVar89;
  auVar68._10_6_ = auVar69._10_6_;
  auVar68._8_2_ = uVar89;
  auVar68._0_8_ = uVar51;
  uVar89 = (undefined2)(uVar51 >> 0x10);
  auVar41._4_8_ = auVar68._8_8_;
  auVar41._2_2_ = uVar89;
  auVar41._0_2_ = uVar89;
  auVar226._0_4_ = ((float)(int)(short)uVar51 - fVar235) * fVar62;
  auVar226._4_4_ = ((float)(auVar41._0_4_ >> 0x10) - fVar237) * fVar93;
  auVar226._8_4_ = ((float)(auVar68._8_4_ >> 0x10) - fVar262) * fVar129;
  auVar226._12_4_ = ((float)(auVar69._12_4_ >> 0x10) - fVar270) * fVar144;
  uVar51 = *(ulong *)(prim + uVar50 * 0x15 + 6);
  uVar89 = (undefined2)(uVar51 >> 0x30);
  auVar73._8_4_ = 0;
  auVar73._0_8_ = uVar51;
  auVar73._12_2_ = uVar89;
  auVar73._14_2_ = uVar89;
  uVar89 = (undefined2)(uVar51 >> 0x20);
  auVar72._12_4_ = auVar73._12_4_;
  auVar72._8_2_ = 0;
  auVar72._0_8_ = uVar51;
  auVar72._10_2_ = uVar89;
  auVar71._10_6_ = auVar72._10_6_;
  auVar71._8_2_ = uVar89;
  auVar71._0_8_ = uVar51;
  uVar89 = (undefined2)(uVar51 >> 0x10);
  auVar42._4_8_ = auVar71._8_8_;
  auVar42._2_2_ = uVar89;
  auVar42._0_2_ = uVar89;
  auVar106._0_8_ =
       CONCAT44(((float)(auVar42._0_4_ >> 0x10) - fVar218) * fVar127,
                ((float)(int)(short)uVar51 - fVar209) * fVar90);
  auVar106._8_4_ = ((float)(auVar71._8_4_ >> 0x10) - fVar220) * fVar140;
  auVar106._12_4_ = ((float)(auVar72._12_4_ >> 0x10) - fVar151) * fVar149;
  uVar51 = *(ulong *)(prim + uVar50 * 0x17 + 6);
  uVar89 = (undefined2)(uVar51 >> 0x30);
  auVar76._8_4_ = 0;
  auVar76._0_8_ = uVar51;
  auVar76._12_2_ = uVar89;
  auVar76._14_2_ = uVar89;
  uVar89 = (undefined2)(uVar51 >> 0x20);
  auVar75._12_4_ = auVar76._12_4_;
  auVar75._8_2_ = 0;
  auVar75._0_8_ = uVar51;
  auVar75._10_2_ = uVar89;
  auVar74._10_6_ = auVar75._10_6_;
  auVar74._8_2_ = uVar89;
  auVar74._0_8_ = uVar51;
  uVar89 = (undefined2)(uVar51 >> 0x10);
  auVar43._4_8_ = auVar74._8_8_;
  auVar43._2_2_ = uVar89;
  auVar43._0_2_ = uVar89;
  auVar210._0_4_ = ((float)(int)(short)uVar51 - fVar209) * fVar90;
  auVar210._4_4_ = ((float)(auVar43._0_4_ >> 0x10) - fVar218) * fVar127;
  auVar210._8_4_ = ((float)(auVar74._8_4_ >> 0x10) - fVar220) * fVar140;
  auVar210._12_4_ = ((float)(auVar75._12_4_ >> 0x10) - fVar151) * fVar149;
  auVar145._8_4_ = auVar153._8_4_;
  auVar145._0_8_ = auVar153._0_8_;
  auVar145._12_4_ = auVar153._12_4_;
  auVar146 = minps(auVar145,auVar170);
  auVar77._8_4_ = auVar130._8_4_;
  auVar77._0_8_ = auVar130._0_8_;
  auVar77._12_4_ = auVar130._12_4_;
  auVar63 = minps(auVar77,auVar226);
  auVar146 = maxps(auVar146,auVar63);
  auVar78._8_4_ = auVar106._8_4_;
  auVar78._0_8_ = auVar106._0_8_;
  auVar78._12_4_ = auVar106._12_4_;
  auVar63 = minps(auVar78,auVar210);
  auVar202._4_4_ = uVar54;
  auVar202._0_4_ = uVar54;
  auVar202._8_4_ = uVar54;
  auVar202._12_4_ = uVar54;
  auVar63 = maxps(auVar63,auVar202);
  auVar63 = maxps(auVar146,auVar63);
  fVar150 = auVar63._0_4_ * 0.99999964;
  fVar62 = auVar63._4_4_ * 0.99999964;
  fVar90 = auVar63._8_4_ * 0.99999964;
  fVar91 = auVar63._12_4_ * 0.99999964;
  auVar146 = maxps(auVar153,auVar170);
  auVar63 = maxps(auVar130,auVar226);
  auVar146 = minps(auVar146,auVar63);
  auVar63 = maxps(auVar106,auVar210);
  uVar54 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar131._4_4_ = uVar54;
  auVar131._0_4_ = uVar54;
  auVar131._8_4_ = uVar54;
  auVar131._12_4_ = uVar54;
  auVar63 = minps(auVar63,auVar131);
  auVar63 = minps(auVar146,auVar63);
  auVar107._0_4_ = -(uint)(PVar5 != (Primitive)0x0 && fVar150 <= auVar63._0_4_ * 1.0000004);
  auVar107._4_4_ = -(uint)(1 < (byte)PVar5 && fVar62 <= auVar63._4_4_ * 1.0000004);
  auVar107._8_4_ = -(uint)(2 < (byte)PVar5 && fVar90 <= auVar63._8_4_ * 1.0000004);
  auVar107._12_4_ = -(uint)(3 < (byte)PVar5 && fVar91 <= auVar63._12_4_ * 1.0000004);
  uVar54 = movmskps((int)unaff_R14,auVar107);
  local_3f0 = CONCAT44((int)((ulong)unaff_R14 >> 0x20),uVar54);
  local_408 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  bVar14 = (int)mm_lookupmask_ps._240_4_ < 0;
  bVar15 = (int)mm_lookupmask_ps._244_4_ < 0;
  bVar16 = (int)mm_lookupmask_ps._248_4_ < 0;
  local_400 = prim;
LAB_002f00cb:
  if (local_3f0 == 0) {
    return;
  }
  lVar10 = 0;
  if (local_3f0 != 0) {
    for (; (local_3f0 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
    }
  }
  uVar56 = *(uint *)(local_400 + 2);
  uVar58 = *(uint *)(local_400 + lVar10 * 4 + 6);
  local_3f8 = (ulong)uVar58;
  pGVar7 = (context->scene->geometries).items[uVar56].ptr;
  lVar8 = *(long *)&pGVar7[1].time_range.upper;
  uVar50 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           local_3f8 *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  pfVar1 = (float *)(lVar8 + (long)pGVar7[1].intersectionFilterN * uVar50);
  fVar129 = *pfVar1;
  fVar140 = pfVar1[1];
  fVar141 = pfVar1[2];
  fVar144 = pfVar1[3];
  lVar10 = uVar50 + 1;
  pfVar1 = (float *)(lVar8 + (long)pGVar7[1].intersectionFilterN * lVar10);
  fVar149 = *pfVar1;
  fVar167 = pfVar1[1];
  fVar182 = pfVar1[2];
  fVar184 = pfVar1[3];
  _Var9 = pGVar7[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(_Var9 + (long)pGVar7[2].userPtr * uVar50);
  fVar224 = *pfVar1;
  fVar209 = pfVar1[1];
  fVar218 = pfVar1[2];
  fVar220 = pfVar1[3];
  pfVar1 = (float *)(_Var9 + (long)pGVar7[2].userPtr * lVar10);
  fVar151 = *pfVar1;
  fVar164 = pfVar1[1];
  fVar165 = pfVar1[2];
  fVar187 = pfVar1[3];
  pfVar1 = (float *)((long)pGVar7[3].userPtr + uVar50 * *(long *)&pGVar7[3].fnumTimeSegments);
  pfVar2 = (float *)((long)pGVar7[3].userPtr + *(long *)&pGVar7[3].fnumTimeSegments * lVar10);
  uVar51 = (long)pGVar7[2].pointQueryFunc * lVar10;
  pfVar3 = (float *)(pGVar7[2].intersectionFilterN + (long)pGVar7[2].pointQueryFunc * uVar50);
  fVar93 = *(float *)(ray + k * 4);
  fVar127 = *(float *)(ray + k * 4 + 0x10);
  fVar128 = *(float *)(ray + k * 4 + 0x20);
  fVar204 = *pfVar3 * 0.33333334 + fVar129;
  fVar206 = pfVar3[1] * 0.33333334 + fVar140;
  fVar240 = pfVar3[2] * 0.33333334 + fVar141;
  fVar252 = pfVar3[3] * 0.33333334 + fVar144;
  pfVar3 = (float *)(pGVar7[2].intersectionFilterN + uVar51);
  fVar280 = fVar149 - *pfVar3 * 0.33333334;
  fVar293 = fVar167 - pfVar3[1] * 0.33333334;
  fVar313 = fVar182 - pfVar3[2] * 0.33333334;
  fVar321 = fVar184 - pfVar3[3] * 0.33333334;
  fVar332 = *pfVar1 * 0.33333334 + fVar224;
  fVar334 = pfVar1[1] * 0.33333334 + fVar209;
  fVar336 = pfVar1[2] * 0.33333334 + fVar218;
  fVar222 = pfVar1[3] * 0.33333334 + fVar220;
  fVar241 = fVar151 - *pfVar2 * 0.33333334;
  fVar253 = fVar164 - pfVar2[1] * 0.33333334;
  fVar256 = fVar165 - pfVar2[2] * 0.33333334;
  fVar259 = fVar187 - pfVar2[3] * 0.33333334;
  fVar255 = fVar280 * 0.0;
  fVar262 = fVar293 * 0.0;
  fVar270 = fVar313 * 0.0;
  fVar273 = fVar321 * 0.0;
  fVar235 = fVar149 * 0.0 + fVar255;
  fVar237 = fVar167 * 0.0 + fVar262;
  fVar274 = fVar182 * 0.0 + fVar270;
  fVar277 = fVar184 * 0.0 + fVar273;
  fVar281 = fVar204 * 0.0;
  fVar289 = fVar206 * 0.0;
  fVar294 = fVar240 * 0.0;
  fVar298 = fVar252 * 0.0;
  fVar288 = fVar281 + fVar235 + fVar129;
  fVar302 = fVar289 + fVar237 + fVar140;
  fVar317 = fVar294 + fVar274 + fVar141;
  fVar325 = fVar298 + fVar277 + fVar144;
  fVar235 = (fVar204 * 3.0 + fVar235) - fVar129 * 3.0;
  fVar237 = (fVar206 * 3.0 + fVar237) - fVar140 * 3.0;
  fVar240 = (fVar240 * 3.0 + fVar274) - fVar141 * 3.0;
  fVar252 = (fVar252 * 3.0 + fVar277) - fVar144 * 3.0;
  fVar282 = fVar241 * 0.0;
  fVar290 = fVar253 * 0.0;
  fVar295 = fVar256 * 0.0;
  fVar299 = fVar259 * 0.0;
  fVar204 = fVar151 * 0.0 + fVar282;
  fVar206 = fVar164 * 0.0 + fVar290;
  fVar274 = fVar165 * 0.0 + fVar295;
  fVar277 = fVar187 * 0.0 + fVar299;
  fVar303 = fVar332 * 0.0;
  fVar314 = fVar334 * 0.0;
  fVar318 = fVar336 * 0.0;
  fVar322 = fVar222 * 0.0;
  fVar326 = fVar303 + fVar204 + fVar224;
  fVar333 = fVar314 + fVar206 + fVar209;
  fVar335 = fVar318 + fVar274 + fVar218;
  fVar337 = fVar322 + fVar277 + fVar220;
  fVar204 = (fVar332 * 3.0 + fVar204) - fVar224 * 3.0;
  fVar332 = (fVar334 * 3.0 + fVar206) - fVar209 * 3.0;
  fVar334 = (fVar336 * 3.0 + fVar274) - fVar218 * 3.0;
  fVar336 = (fVar222 * 3.0 + fVar277) - fVar220 * 3.0;
  fVar206 = fVar255 + fVar149 + fVar281 + fVar129 * 0.0;
  fVar255 = fVar262 + fVar167 + fVar289 + fVar140 * 0.0;
  fVar262 = fVar270 + fVar182 + fVar294 + fVar141 * 0.0;
  fVar270 = fVar273 + fVar184 + fVar298 + fVar144 * 0.0;
  fVar129 = ((fVar149 * 3.0 - fVar280 * 3.0) + fVar281) - fVar129 * 0.0;
  fVar140 = ((fVar167 * 3.0 - fVar293 * 3.0) + fVar289) - fVar140 * 0.0;
  fVar141 = ((fVar182 * 3.0 - fVar313 * 3.0) + fVar294) - fVar141 * 0.0;
  fVar144 = ((fVar184 * 3.0 - fVar321 * 3.0) + fVar298) - fVar144 * 0.0;
  fVar280 = fVar282 + fVar151 + fVar303 + fVar224 * 0.0;
  fVar313 = fVar290 + fVar164 + fVar314 + fVar209 * 0.0;
  fVar321 = fVar295 + fVar165 + fVar318 + fVar218 * 0.0;
  fVar222 = fVar299 + fVar187 + fVar322 + fVar220 * 0.0;
  fVar149 = ((fVar151 * 3.0 - fVar241 * 3.0) + fVar303) - fVar224 * 0.0;
  fVar167 = ((fVar164 * 3.0 - fVar253 * 3.0) + fVar314) - fVar209 * 0.0;
  fVar182 = ((fVar165 * 3.0 - fVar256 * 3.0) + fVar318) - fVar218 * 0.0;
  fVar184 = ((fVar187 * 3.0 - fVar259 * 3.0) + fVar322) - fVar220 * 0.0;
  fVar277 = fVar237 * fVar326 - fVar333 * fVar235;
  fVar289 = fVar240 * fVar333 - fVar335 * fVar237;
  fVar290 = fVar235 * fVar335 - fVar326 * fVar240;
  fVar294 = fVar252 * fVar337 - fVar337 * fVar252;
  fVar273 = fVar237 * fVar204 - fVar332 * fVar235;
  fVar293 = fVar240 * fVar332 - fVar334 * fVar237;
  fVar241 = fVar235 * fVar334 - fVar204 * fVar240;
  fVar164 = fVar140 * fVar280 - fVar313 * fVar129;
  fVar313 = fVar141 * fVar313 - fVar321 * fVar140;
  fVar321 = fVar129 * fVar321 - fVar280 * fVar141;
  fVar334 = fVar144 * fVar222 - fVar222 * fVar144;
  fVar224 = fVar140 * fVar149 - fVar167 * fVar129;
  fVar167 = fVar141 * fVar167 - fVar182 * fVar140;
  fVar209 = fVar129 * fVar182 - fVar149 * fVar141;
  fVar259 = fVar290 * fVar290 + fVar289 * fVar289 + fVar277 * fVar277;
  auVar146 = ZEXT416((uint)fVar259);
  auVar63 = rsqrtss(ZEXT416((uint)fVar259),auVar146);
  fVar149 = auVar63._0_4_;
  fVar281 = fVar149 * 1.5 - fVar149 * fVar149 * fVar259 * 0.5 * fVar149;
  fVar295 = fVar277 * fVar273 + fVar290 * fVar241 + fVar289 * fVar293;
  fVar149 = fVar294 * fVar281;
  auVar63 = rcpss(auVar146,auVar146);
  fVar280 = (2.0 - fVar259 * auVar63._0_4_) * auVar63._0_4_;
  fVar253 = fVar321 * fVar321 + fVar313 * fVar313 + fVar164 * fVar164;
  auVar63 = ZEXT416((uint)fVar253);
  auVar146 = rsqrtss(ZEXT416((uint)fVar253),auVar63);
  fVar182 = auVar146._0_4_;
  fVar187 = fVar182 * 1.5 - fVar182 * fVar182 * fVar253 * 0.5 * fVar182;
  fVar282 = fVar164 * fVar224 + fVar321 * fVar209 + fVar313 * fVar167;
  fVar220 = fVar334 * fVar187;
  auVar63 = rcpss(auVar63,auVar63);
  fVar182 = (2.0 - fVar253 * auVar63._0_4_) * auVar63._0_4_;
  fVar218 = fVar325 * fVar289 * fVar281;
  fVar151 = fVar325 * fVar290 * fVar281;
  fVar165 = fVar325 * fVar277 * fVar281;
  fVar204 = fVar325 * fVar149;
  fVar332 = fVar288 - fVar218;
  fVar222 = fVar302 - fVar151;
  fVar256 = fVar317 - fVar165;
  fVar274 = fVar325 - fVar204;
  fVar303 = fVar325 * fVar280 * (fVar259 * fVar293 - fVar295 * fVar289) * fVar281 +
            fVar252 * fVar289 * fVar281;
  fVar314 = fVar325 * fVar280 * (fVar259 * fVar241 - fVar295 * fVar290) * fVar281 +
            fVar252 * fVar290 * fVar281;
  fVar318 = fVar325 * fVar280 * (fVar259 * fVar273 - fVar295 * fVar277) * fVar281 +
            fVar252 * fVar277 * fVar281;
  fVar322 = fVar325 * fVar280 * (fVar259 * (fVar252 * fVar336 - fVar336 * fVar252) -
                                fVar295 * fVar294) * fVar281 + fVar252 * fVar149;
  fVar218 = fVar218 + fVar288;
  fVar151 = fVar151 + fVar302;
  fVar165 = fVar165 + fVar317;
  fVar204 = fVar204 + fVar325;
  fVar273 = fVar270 * fVar313 * fVar187;
  fVar280 = fVar270 * fVar321 * fVar187;
  fVar288 = fVar270 * fVar164 * fVar187;
  fVar293 = fVar270 * fVar220;
  fVar277 = fVar206 - fVar273;
  fVar289 = fVar255 - fVar280;
  fVar295 = fVar262 - fVar288;
  fVar299 = fVar270 - fVar293;
  fVar149 = fVar270 * fVar182 * (fVar253 * fVar167 - fVar282 * fVar313) * fVar187 +
            fVar144 * fVar313 * fVar187;
  fVar167 = fVar270 * fVar182 * (fVar253 * fVar209 - fVar282 * fVar321) * fVar187 +
            fVar144 * fVar321 * fVar187;
  fVar224 = fVar270 * fVar182 * (fVar253 * fVar224 - fVar282 * fVar164) * fVar187 +
            fVar144 * fVar164 * fVar187;
  fVar209 = fVar270 * fVar182 * (fVar253 * (fVar144 * fVar184 - fVar184 * fVar144) -
                                fVar282 * fVar334) * fVar187 + fVar144 * fVar220;
  fVar273 = fVar273 + fVar206;
  fVar280 = fVar280 + fVar255;
  fVar288 = fVar288 + fVar262;
  fVar293 = fVar293 + fVar270;
  fVar220 = (fVar235 - fVar303) * 0.33333334 + fVar332;
  fVar164 = (fVar237 - fVar314) * 0.33333334 + fVar222;
  fVar187 = (fVar240 - fVar318) * 0.33333334 + fVar256;
  fVar206 = (fVar252 - fVar322) * 0.33333334 + fVar274;
  fVar302 = fVar277 - (fVar129 - fVar149) * 0.33333334;
  fVar313 = fVar289 - (fVar140 - fVar167) * 0.33333334;
  fVar317 = fVar295 - (fVar141 - fVar224) * 0.33333334;
  fVar321 = fVar299 - (fVar144 - fVar209) * 0.33333334;
  fVar182 = fVar273 - (fVar149 + fVar129) * 0.33333334;
  fVar184 = fVar280 - (fVar167 + fVar140) * 0.33333334;
  fVar224 = fVar288 - (fVar224 + fVar141) * 0.33333334;
  fVar209 = fVar293 - (fVar209 + fVar144) * 0.33333334;
  fVar255 = fVar332 - fVar93;
  fVar262 = fVar222 - fVar127;
  fVar270 = fVar256 - fVar128;
  fVar129 = pre->ray_space[k].vx.field_0.m128[0];
  fVar140 = pre->ray_space[k].vx.field_0.m128[1];
  fVar141 = pre->ray_space[k].vy.field_0.m128[0];
  fVar144 = pre->ray_space[k].vy.field_0.m128[1];
  fVar149 = pre->ray_space[k].vz.field_0.m128[0];
  fVar167 = pre->ray_space[k].vz.field_0.m128[1];
  fVar338 = fVar255 * fVar129 + fVar262 * fVar141 + fVar270 * fVar149;
  fVar343 = fVar255 * fVar140 + fVar262 * fVar144 + fVar270 * fVar167;
  auVar79._4_4_ = fVar343;
  auVar79._0_4_ = fVar338;
  fVar347 = fVar220 - fVar93;
  fVar351 = fVar164 - fVar127;
  fVar354 = fVar187 - fVar128;
  fVar348 = fVar347 * fVar129 + fVar351 * fVar141 + fVar354 * fVar149;
  fVar352 = fVar347 * fVar140 + fVar351 * fVar144 + fVar354 * fVar167;
  auVar171._4_4_ = fVar352;
  auVar171._0_4_ = fVar348;
  fVar334 = fVar302 - fVar93;
  fVar241 = fVar313 - fVar127;
  fVar259 = fVar317 - fVar128;
  fVar336 = fVar334 * fVar129 + fVar241 * fVar141 + fVar259 * fVar149;
  fVar253 = fVar334 * fVar140 + fVar241 * fVar144 + fVar259 * fVar167;
  auVar108._4_4_ = fVar253;
  auVar108._0_4_ = fVar336;
  fVar281 = fVar277 - fVar93;
  fVar290 = fVar289 - fVar127;
  fVar298 = fVar295 - fVar128;
  fVar282 = fVar281 * fVar129 + fVar290 * fVar141 + fVar298 * fVar149;
  fVar294 = fVar281 * fVar140 + fVar290 * fVar144 + fVar298 * fVar167;
  auVar329._4_4_ = fVar294;
  auVar329._0_4_ = fVar282;
  fVar333 = fVar218 - fVar93;
  fVar337 = fVar151 - fVar127;
  fVar296 = fVar165 - fVar128;
  fVar335 = fVar333 * fVar129 + fVar337 * fVar141 + fVar296 * fVar149;
  fVar291 = fVar333 * fVar140 + fVar337 * fVar144 + fVar296 * fVar167;
  fVar304 = (fVar303 + fVar235) * 0.33333334 + fVar218;
  fVar315 = (fVar314 + fVar237) * 0.33333334 + fVar151;
  fVar319 = (fVar318 + fVar240) * 0.33333334 + fVar165;
  fVar323 = (fVar322 + fVar252) * 0.33333334 + fVar204;
  fVar303 = fVar304 - fVar93;
  fVar318 = fVar315 - fVar127;
  fVar326 = fVar319 - fVar128;
  fVar314 = fVar303 * fVar129 + fVar318 * fVar141 + fVar326 * fVar149;
  fVar322 = fVar303 * fVar140 + fVar318 * fVar144 + fVar326 * fVar167;
  auVar171._12_4_ = fVar322;
  auVar171._8_4_ = fVar314;
  fVar235 = fVar182 - fVar93;
  fVar240 = fVar184 - fVar127;
  fVar325 = fVar224 - fVar128;
  fVar237 = fVar235 * fVar129 + fVar240 * fVar141 + fVar325 * fVar149;
  fVar252 = fVar235 * fVar140 + fVar240 * fVar144 + fVar325 * fVar167;
  fVar93 = fVar273 - fVar93;
  fVar127 = fVar280 - fVar127;
  fVar128 = fVar288 - fVar128;
  fVar141 = fVar93 * fVar129 + fVar127 * fVar141 + fVar128 * fVar149;
  fVar140 = fVar93 * fVar140 + fVar127 * fVar144 + fVar128 * fVar167;
  auVar329._12_4_ = fVar140;
  auVar329._8_4_ = fVar141;
  auVar79._8_4_ = fVar335;
  auVar79._12_4_ = fVar291;
  auVar63 = minps(auVar79,auVar171);
  auVar108._8_4_ = fVar237;
  auVar108._12_4_ = fVar252;
  auVar146 = minps(auVar108,auVar329);
  auVar63 = minps(auVar63,auVar146);
  auVar109._4_4_ = fVar343;
  auVar109._0_4_ = fVar338;
  auVar109._8_4_ = fVar335;
  auVar109._12_4_ = fVar291;
  auVar146 = maxps(auVar109,auVar171);
  auVar132._4_4_ = fVar253;
  auVar132._0_4_ = fVar336;
  auVar132._8_4_ = fVar237;
  auVar132._12_4_ = fVar252;
  auVar133 = maxps(auVar132,auVar329);
  auVar110 = maxps(auVar146,auVar133);
  auVar17._4_8_ = auVar133._8_8_;
  auVar17._0_4_ = auVar63._4_4_;
  auVar134._0_8_ = auVar17._0_8_ << 0x20;
  auVar134._8_4_ = auVar63._8_4_;
  auVar134._12_4_ = auVar63._12_4_;
  auVar135._8_8_ = auVar63._8_8_;
  auVar135._0_8_ = auVar134._8_8_;
  auVar146 = minps(auVar63,auVar135);
  auVar18._4_8_ = auVar63._8_8_;
  auVar18._0_4_ = auVar110._4_4_;
  auVar136._0_8_ = auVar18._0_8_ << 0x20;
  auVar136._8_4_ = auVar110._8_4_;
  auVar136._12_4_ = auVar110._12_4_;
  auVar137._8_8_ = auVar110._8_8_;
  auVar137._0_8_ = auVar136._8_8_;
  auVar63 = maxps(auVar110,auVar137);
  auVar80._0_8_ = auVar146._0_8_ & 0x7fffffff7fffffff;
  auVar80._8_4_ = auVar146._8_4_ & 0x7fffffff;
  auVar80._12_4_ = auVar146._12_4_ & 0x7fffffff;
  auVar111._0_8_ = auVar63._0_8_ & 0x7fffffff7fffffff;
  auVar111._8_4_ = auVar63._8_4_ & 0x7fffffff;
  auVar111._12_4_ = auVar63._12_4_ & 0x7fffffff;
  auVar63 = maxps(auVar80,auVar111);
  fVar129 = auVar63._4_4_;
  if (auVar63._4_4_ <= auVar63._0_4_) {
    fVar129 = auVar63._0_4_;
  }
  iVar44 = (int)local_3f0;
  fVar129 = fVar129 * 9.536743e-07;
  uVar50 = 0;
  local_538._0_4_ = 0.0;
  local_538._4_4_ = 1.0;
  fStack_530 = 0.0;
  fStack_52c = 0.0;
  local_518.lower = 0.0;
  local_518.upper = 1.0;
LAB_002f0951:
  do {
    fVar144 = 1.0 - (float)local_538._0_4_;
    fVar149 = 1.0 - (float)local_538._0_4_;
    fVar167 = 1.0 - (float)local_538._4_4_;
    fVar300 = 1.0 - (float)local_538._4_4_;
    fVar263 = fVar338 * fVar144 + fVar335 * (float)local_538._0_4_;
    fVar271 = fVar343 * fVar149 + fVar291 * (float)local_538._0_4_;
    fVar275 = fVar338 * fVar167 + fVar335 * (float)local_538._4_4_;
    fVar278 = fVar343 * fVar300 + fVar291 * (float)local_538._4_4_;
    fVar242 = fVar348 * fVar144 + fVar314 * (float)local_538._0_4_;
    fVar254 = fVar352 * fVar149 + fVar322 * (float)local_538._0_4_;
    fVar257 = fVar348 * fVar167 + fVar314 * (float)local_538._4_4_;
    fVar260 = fVar352 * fVar300 + fVar322 * (float)local_538._4_4_;
    fVar349 = fVar336 * fVar144 + fVar237 * (float)local_538._0_4_;
    fVar353 = fVar253 * fVar149 + fVar252 * (float)local_538._0_4_;
    fVar355 = fVar336 * fVar167 + fVar237 * (float)local_538._4_4_;
    fVar356 = fVar253 * fVar300 + fVar252 * (float)local_538._4_4_;
    fVar283 = fVar144 * fVar282 + (float)local_538._0_4_ * fVar141;
    fVar292 = fVar149 * fVar294 + (float)local_538._0_4_ * fVar140;
    fVar297 = fVar167 * fVar282 + (float)local_538._4_4_ * fVar141;
    fVar301 = fVar300 * fVar294 + (float)local_538._4_4_ * fVar140;
    fVar327 = (local_518.upper - local_518.lower) * 0.11111111;
    fVar339 = (local_518.upper - local_518.lower) * 0.0 + local_518.lower;
    fVar344 = (local_518.upper - local_518.lower) * 0.33333334 + local_518.lower;
    fVar345 = (local_518.upper - local_518.lower) * 0.6666667 + local_518.lower;
    fVar346 = (local_518.upper - local_518.lower) * 1.0 + local_518.lower;
    fVar167 = 1.0 - fVar339;
    fVar300 = 1.0 - fVar344;
    fVar142 = 1.0 - fVar345;
    fVar143 = 1.0 - fVar346;
    fVar168 = fVar242 * fVar167 + fVar349 * fVar339;
    fVar183 = fVar242 * fVar300 + fVar349 * fVar344;
    fVar185 = fVar242 * fVar142 + fVar349 * fVar345;
    fVar186 = fVar242 * fVar143 + fVar349 * fVar346;
    fVar188 = fVar254 * fVar167 + fVar353 * fVar339;
    fVar205 = fVar254 * fVar300 + fVar353 * fVar344;
    fVar207 = fVar254 * fVar142 + fVar353 * fVar345;
    fVar208 = fVar254 * fVar143 + fVar353 * fVar346;
    fVar144 = (fVar263 * fVar167 + fVar242 * fVar339) * fVar167 + fVar339 * fVar168;
    fVar149 = (fVar263 * fVar300 + fVar242 * fVar344) * fVar300 + fVar344 * fVar183;
    fVar166 = (fVar263 * fVar142 + fVar242 * fVar345) * fVar142 + fVar345 * fVar185;
    fVar242 = (fVar263 * fVar143 + fVar242 * fVar346) * fVar143 + fVar346 * fVar186;
    fVar263 = (fVar271 * fVar167 + fVar254 * fVar339) * fVar167 + fVar339 * fVar188;
    fVar219 = (fVar271 * fVar300 + fVar254 * fVar344) * fVar300 + fVar344 * fVar205;
    fVar221 = (fVar271 * fVar142 + fVar254 * fVar345) * fVar142 + fVar345 * fVar207;
    fVar223 = (fVar271 * fVar143 + fVar254 * fVar346) * fVar143 + fVar346 * fVar208;
    fVar254 = fVar168 * fVar167 + (fVar349 * fVar167 + fVar283 * fVar339) * fVar339;
    fVar168 = fVar183 * fVar300 + (fVar349 * fVar300 + fVar283 * fVar344) * fVar344;
    fVar183 = fVar185 * fVar142 + (fVar349 * fVar142 + fVar283 * fVar345) * fVar345;
    fVar185 = fVar186 * fVar143 + (fVar349 * fVar143 + fVar283 * fVar346) * fVar346;
    fVar186 = fVar188 * fVar167 + (fVar353 * fVar167 + fVar292 * fVar339) * fVar339;
    fVar188 = fVar205 * fVar300 + (fVar353 * fVar300 + fVar292 * fVar344) * fVar344;
    fVar205 = fVar207 * fVar142 + (fVar353 * fVar142 + fVar292 * fVar345) * fVar345;
    fVar207 = fVar208 * fVar143 + (fVar353 * fVar143 + fVar292 * fVar346) * fVar346;
    fVar271 = fVar167 * fVar144 + fVar339 * fVar254;
    fVar283 = fVar300 * fVar149 + fVar344 * fVar168;
    fVar292 = fVar142 * fVar166 + fVar345 * fVar183;
    fVar349 = fVar143 * fVar242 + fVar346 * fVar185;
    fVar305 = fVar167 * fVar263 + fVar339 * fVar186;
    fVar316 = fVar300 * fVar219 + fVar344 * fVar188;
    fVar320 = fVar142 * fVar221 + fVar345 * fVar205;
    fVar324 = fVar143 * fVar223 + fVar346 * fVar207;
    fVar149 = (fVar168 - fVar149) * 3.0 * fVar327;
    fVar168 = (fVar183 - fVar166) * 3.0 * fVar327;
    fVar183 = (fVar185 - fVar242) * 3.0 * fVar327;
    fVar185 = (fVar188 - fVar219) * 3.0 * fVar327;
    fVar188 = (fVar205 - fVar221) * 3.0 * fVar327;
    fVar205 = (fVar207 - fVar223) * 3.0 * fVar327;
    fVar225 = fVar271 + (fVar254 - fVar144) * 3.0 * fVar327;
    fVar236 = fVar283 + fVar149;
    fVar238 = fVar292 + fVar168;
    fVar239 = fVar349 + fVar183;
    fVar144 = fVar305 + (fVar186 - fVar263) * 3.0 * fVar327;
    fVar166 = fVar316 + fVar185;
    fVar242 = fVar320 + fVar188;
    fVar186 = fVar324 + fVar205;
    fVar149 = fVar283 - fVar149;
    fVar168 = fVar292 - fVar168;
    fVar183 = fVar349 - fVar183;
    local_508._0_4_ = fVar316 - fVar185;
    local_508._4_4_ = fVar320 - fVar188;
    fStack_500 = fVar324 - fVar205;
    fStack_4fc = 0.0;
    fVar205 = fVar257 * fVar167 + fVar355 * fVar339;
    fVar207 = fVar257 * fVar300 + fVar355 * fVar344;
    fVar208 = fVar257 * fVar142 + fVar355 * fVar345;
    fVar263 = fVar257 * fVar143 + fVar355 * fVar346;
    fVar219 = fVar260 * fVar167 + fVar356 * fVar339;
    fVar221 = fVar260 * fVar300 + fVar356 * fVar344;
    fVar223 = fVar260 * fVar142 + fVar356 * fVar345;
    fVar261 = fVar260 * fVar143 + fVar356 * fVar346;
    fVar185 = (fVar275 * fVar167 + fVar257 * fVar339) * fVar167 + fVar339 * fVar205;
    fVar254 = (fVar275 * fVar300 + fVar257 * fVar344) * fVar300 + fVar344 * fVar207;
    fVar188 = (fVar275 * fVar142 + fVar257 * fVar345) * fVar142 + fVar345 * fVar208;
    fVar275 = (fVar275 * fVar143 + fVar257 * fVar346) * fVar143 + fVar346 * fVar263;
    fVar264 = (fVar278 * fVar167 + fVar260 * fVar339) * fVar167 + fVar339 * fVar219;
    fVar272 = (fVar278 * fVar300 + fVar260 * fVar344) * fVar300 + fVar344 * fVar221;
    fVar276 = (fVar278 * fVar142 + fVar260 * fVar345) * fVar142 + fVar345 * fVar223;
    fVar279 = (fVar278 * fVar143 + fVar260 * fVar346) * fVar143 + fVar346 * fVar261;
    fVar260 = fVar205 * fVar167 + (fVar355 * fVar167 + fVar297 * fVar339) * fVar339;
    fVar278 = fVar207 * fVar300 + (fVar355 * fVar300 + fVar297 * fVar344) * fVar344;
    fVar353 = fVar208 * fVar142 + (fVar355 * fVar142 + fVar297 * fVar345) * fVar345;
    fVar297 = fVar263 * fVar143 + (fVar355 * fVar143 + fVar297 * fVar346) * fVar346;
    fVar243 = fVar219 * fVar167 + (fVar356 * fVar167 + fVar301 * fVar339) * fVar339;
    fVar355 = fVar221 * fVar300 + (fVar356 * fVar300 + fVar301 * fVar344) * fVar344;
    fVar258 = fVar223 * fVar142 + (fVar356 * fVar142 + fVar301 * fVar345) * fVar345;
    fVar261 = fVar261 * fVar143 + (fVar356 * fVar143 + fVar301 * fVar346) * fVar346;
    fVar219 = fVar167 * fVar185 + fVar339 * fVar260;
    fVar221 = fVar300 * fVar254 + fVar344 * fVar278;
    fVar223 = fVar142 * fVar188 + fVar345 * fVar353;
    fVar257 = fVar143 * fVar275 + fVar346 * fVar297;
    fVar205 = fVar167 * fVar264 + fVar339 * fVar243;
    fVar207 = fVar300 * fVar272 + fVar344 * fVar355;
    fVar208 = fVar142 * fVar276 + fVar345 * fVar258;
    fVar263 = fVar143 * fVar279 + fVar346 * fVar261;
    fVar167 = (fVar278 - fVar254) * 3.0 * fVar327;
    fVar142 = (fVar353 - fVar188) * 3.0 * fVar327;
    fVar254 = (fVar297 - fVar275) * 3.0 * fVar327;
    fVar297 = (fVar355 - fVar272) * 3.0 * fVar327;
    fVar355 = (fVar258 - fVar276) * 3.0 * fVar327;
    fVar258 = (fVar261 - fVar279) * 3.0 * fVar327;
    fVar276 = fVar219 + (fVar260 - fVar185) * 3.0 * fVar327;
    fVar279 = fVar221 + fVar167;
    fVar301 = fVar223 + fVar142;
    fVar339 = fVar257 + fVar254;
    fVar243 = fVar205 + (fVar243 - fVar264) * 3.0 * fVar327;
    fVar261 = fVar207 + fVar297;
    fVar264 = fVar208 + fVar355;
    fVar272 = fVar263 + fVar258;
    fVar167 = fVar221 - fVar167;
    fVar142 = fVar223 - fVar142;
    fVar254 = fVar257 - fVar254;
    fVar297 = fVar207 - fVar297;
    fVar355 = fVar208 - fVar355;
    fVar258 = fVar263 - fVar258;
    fVar300 = (fVar221 - fVar283) + (fVar219 - fVar271);
    fVar143 = (fVar223 - fVar292) + (fVar221 - fVar283);
    fVar185 = (fVar257 - fVar349) + (fVar223 - fVar292);
    fVar188 = (fVar257 - fVar349) + 0.0;
    fVar275 = (fVar207 - fVar316) + (fVar205 - fVar305);
    fVar260 = (fVar208 - fVar320) + (fVar207 - fVar316);
    fVar278 = (fVar263 - fVar324) + (fVar208 - fVar320);
    fVar353 = (fVar263 - fVar324) + 0.0;
    auVar211._0_8_ =
         CONCAT44(fVar316 * fVar143 - fVar283 * fVar260,fVar305 * fVar300 - fVar271 * fVar275);
    auVar211._8_4_ = fVar320 * fVar185 - fVar292 * fVar278;
    auVar211._12_4_ = fVar324 * fVar188 - fVar349 * fVar353;
    auVar154._0_4_ = fVar144 * fVar300 - fVar225 * fVar275;
    auVar154._4_4_ = fVar166 * fVar143 - fVar236 * fVar260;
    auVar154._8_4_ = fVar242 * fVar185 - fVar238 * fVar278;
    auVar154._12_4_ = fVar186 * fVar188 - fVar239 * fVar353;
    auVar172._0_8_ =
         CONCAT44((float)local_508._4_4_ * fVar143 - fVar260 * fVar168,
                  (float)local_508._0_4_ * fVar300 - fVar275 * fVar149);
    auVar172._8_4_ = fStack_500 * fVar185 - fVar278 * fVar183;
    auVar172._12_4_ = fVar188 * 0.0 - fVar353 * 0.0;
    auVar310._0_4_ = fVar300 * fVar316 - fVar275 * fVar283;
    auVar310._4_4_ = fVar143 * fVar320 - fVar260 * fVar292;
    auVar310._8_4_ = fVar185 * fVar324 - fVar278 * fVar349;
    auVar310._12_4_ = fVar188 * 0.0 - fVar353 * 0.0;
    auVar245._0_8_ =
         CONCAT44(fVar207 * fVar143 - fVar221 * fVar260,fVar205 * fVar300 - fVar219 * fVar275);
    auVar245._8_4_ = fVar208 * fVar185 - fVar223 * fVar278;
    auVar245._12_4_ = fVar263 * fVar188 - fVar257 * fVar353;
    auVar330._0_4_ = fVar243 * fVar300 - fVar276 * fVar275;
    auVar330._4_4_ = fVar261 * fVar143 - fVar279 * fVar260;
    auVar330._8_4_ = fVar264 * fVar185 - fVar301 * fVar278;
    auVar330._12_4_ = fVar272 * fVar188 - fVar339 * fVar353;
    auVar227._0_8_ =
         CONCAT44(fVar355 * fVar143 - fVar260 * fVar142,fVar297 * fVar300 - fVar275 * fVar167);
    auVar227._8_4_ = fVar258 * fVar185 - fVar278 * fVar254;
    auVar227._12_4_ = fVar188 * 0.0 - fVar353 * 0.0;
    local_a8._0_4_ = fVar300 * fVar207 - fVar275 * fVar221;
    local_a8._4_4_ = fVar143 * fVar208 - fVar260 * fVar223;
    local_a8._8_4_ = fVar185 * fVar263 - fVar278 * fVar257;
    local_a8._12_4_ = fVar188 * 0.0 - fVar353 * 0.0;
    auVar112._8_4_ = auVar211._8_4_;
    auVar112._0_8_ = auVar211._0_8_;
    auVar112._12_4_ = auVar211._12_4_;
    auVar63 = minps(auVar112,auVar154);
    auVar110 = maxps(auVar211,auVar154);
    auVar155._8_4_ = auVar172._8_4_;
    auVar155._0_8_ = auVar172._0_8_;
    auVar155._12_4_ = auVar172._12_4_;
    auVar146 = minps(auVar155,auVar310);
    auVar63 = minps(auVar63,auVar146);
    auVar146 = maxps(auVar172,auVar310);
    auVar133 = maxps(auVar110,auVar146);
    auVar156._8_4_ = auVar245._8_4_;
    auVar156._0_8_ = auVar245._0_8_;
    auVar156._12_4_ = auVar245._12_4_;
    auVar146 = minps(auVar156,auVar330);
    auVar246 = maxps(auVar245,auVar330);
    auVar173._8_4_ = auVar227._8_4_;
    auVar173._0_8_ = auVar227._0_8_;
    auVar173._12_4_ = auVar227._12_4_;
    auVar110 = minps(auVar173,local_a8);
    auVar146 = minps(auVar146,auVar110);
    auVar63 = minps(auVar63,auVar146);
    auVar146 = maxps(auVar227,local_a8);
    auVar146 = maxps(auVar246,auVar146);
    auVar146 = maxps(auVar133,auVar146);
    bVar55 = auVar63._4_4_ <= fVar129;
    bVar12 = auVar63._8_4_ <= fVar129;
    auVar45._4_4_ = -(uint)bVar12;
    auVar45._0_4_ = -(uint)bVar55;
    auVar45._8_4_ = -(uint)(auVar63._12_4_ <= fVar129);
    auVar45._12_4_ = 0;
    auVar116 = auVar45 << 0x20;
    bVar47 = (-fVar129 <= auVar146._0_4_ && auVar63._0_4_ <= fVar129) && bVar14;
    auVar212._0_4_ = -(uint)bVar47;
    bVar48 = (-fVar129 <= auVar146._4_4_ && bVar55) && bVar15;
    auVar212._4_4_ = -(uint)bVar48;
    bVar55 = (-fVar129 <= auVar146._8_4_ && bVar12) && bVar16;
    auVar212._8_4_ = -(uint)bVar55;
    auVar212._12_4_ = 0;
    uVar60 = movmskps((int)uVar51,auVar212);
    uVar51 = (ulong)uVar60;
    if (uVar60 != 0) {
      fVar300 = (fVar221 - fVar219) + (fVar283 - fVar271);
      fVar143 = (fVar223 - fVar221) + (fVar292 - fVar283);
      fVar185 = (fVar257 - fVar223) + (fVar349 - fVar292);
      fVar188 = (0.0 - fVar257) + (0.0 - fVar349);
      fVar275 = (fVar207 - fVar205) + (fVar316 - fVar305);
      fVar260 = (fVar208 - fVar207) + (fVar320 - fVar316);
      fVar278 = (fVar263 - fVar208) + (fVar324 - fVar320);
      fVar353 = (0.0 - fVar263) + (0.0 - fVar324);
      auVar340._0_8_ =
           CONCAT44(fVar316 * fVar143 - fVar283 * fVar260,fVar305 * fVar300 - fVar271 * fVar275);
      auVar340._8_4_ = fVar320 * fVar185 - fVar292 * fVar278;
      auVar340._12_4_ = fVar324 * fVar188 - fVar349 * fVar353;
      auVar157._0_4_ = fVar144 * fVar300 - fVar225 * fVar275;
      auVar157._4_4_ = fVar166 * fVar143 - fVar236 * fVar260;
      auVar157._8_4_ = fVar242 * fVar185 - fVar238 * fVar278;
      auVar157._12_4_ = fVar186 * fVar188 - fVar239 * fVar353;
      auVar228._0_8_ =
           CONCAT44((float)local_508._4_4_ * fVar143 - fVar168 * fVar260,
                    (float)local_508._0_4_ * fVar300 - fVar149 * fVar275);
      auVar228._8_4_ = fStack_500 * fVar185 - fVar183 * fVar278;
      auVar228._12_4_ = fVar188 * 0.0 - fVar353 * 0.0;
      auVar174._0_4_ = fVar316 * fVar300 - fVar283 * fVar275;
      auVar174._4_4_ = fVar320 * fVar143 - fVar292 * fVar260;
      auVar174._8_4_ = fVar324 * fVar185 - fVar349 * fVar278;
      auVar174._12_4_ = fVar188 * 0.0 - fVar353 * 0.0;
      auVar138._0_8_ =
           CONCAT44(fVar207 * fVar143 - fVar221 * fVar260,fVar205 * fVar300 - fVar219 * fVar275);
      auVar138._8_4_ = fVar208 * fVar185 - fVar223 * fVar278;
      auVar138._12_4_ = fVar263 * fVar188 - fVar257 * fVar353;
      auVar265._0_4_ = fVar243 * fVar300 - fVar276 * fVar275;
      auVar265._4_4_ = fVar261 * fVar143 - fVar279 * fVar260;
      auVar265._8_4_ = fVar264 * fVar185 - fVar301 * fVar278;
      auVar265._12_4_ = fVar272 * fVar188 - fVar339 * fVar353;
      auVar311._0_8_ =
           CONCAT44(fVar355 * fVar143 - fVar142 * fVar260,fVar297 * fVar300 - fVar167 * fVar275);
      auVar311._8_4_ = fVar258 * fVar185 - fVar254 * fVar278;
      auVar311._12_4_ = fVar188 * 0.0 - fVar353 * 0.0;
      local_a8._0_4_ = fVar300 * fVar207 - fVar275 * fVar221;
      local_a8._4_4_ = fVar143 * fVar208 - fVar260 * fVar223;
      local_a8._8_4_ = fVar185 * fVar263 - fVar278 * fVar257;
      local_a8._12_4_ = fVar188 * 0.0 - fVar353 * 0.0;
      auVar113._8_4_ = auVar340._8_4_;
      auVar113._0_8_ = auVar340._0_8_;
      auVar113._12_4_ = auVar340._12_4_;
      auVar63 = minps(auVar113,auVar157);
      auVar110 = maxps(auVar340,auVar157);
      auVar158._8_4_ = auVar228._8_4_;
      auVar158._0_8_ = auVar228._0_8_;
      auVar158._12_4_ = auVar228._12_4_;
      auVar146 = minps(auVar158,auVar174);
      auVar63 = minps(auVar63,auVar146);
      auVar146 = maxps(auVar228,auVar174);
      auVar246 = maxps(auVar110,auVar146);
      auVar159._8_4_ = auVar138._8_4_;
      auVar159._0_8_ = auVar138._0_8_;
      auVar159._12_4_ = auVar138._12_4_;
      auVar110 = minps(auVar159,auVar265);
      auVar146 = maxps(auVar138,auVar265);
      auVar175._8_4_ = auVar311._8_4_;
      auVar175._0_8_ = auVar311._0_8_;
      auVar175._12_4_ = auVar311._12_4_;
      auVar133 = minps(auVar175,local_a8);
      auVar110 = minps(auVar110,auVar133);
      auVar63 = minps(auVar63,auVar110);
      auVar110 = maxps(auVar311,local_a8);
      auVar146 = maxps(auVar146,auVar110);
      auVar146 = maxps(auVar246,auVar146);
      bVar12 = auVar63._4_4_ <= fVar129;
      bVar13 = auVar63._8_4_ <= fVar129;
      auVar46._4_4_ = -(uint)bVar13;
      auVar46._0_4_ = -(uint)bVar12;
      auVar46._8_4_ = -(uint)(auVar63._12_4_ <= fVar129);
      auVar46._12_4_ = 0;
      auVar116 = auVar46 << 0x20;
      auVar341._0_4_ = -(uint)((-fVar129 <= auVar146._0_4_ && auVar63._0_4_ <= fVar129) && bVar47);
      auVar341._4_4_ = -(uint)((-fVar129 <= auVar146._4_4_ && bVar12) && bVar48);
      auVar341._8_4_ = -(uint)((-fVar129 <= auVar146._8_4_ && bVar13) && bVar55);
      auVar341._12_4_ = 0;
      uVar60 = movmskps(uVar60,auVar341);
      uVar51 = (ulong)uVar60;
      if (uVar60 != 0) {
        uVar51 = (ulong)(byte)uVar60;
        mask_stack[uVar50] = uVar60 & 0xff;
        cu_stack[uVar50] = local_518;
        cv_stack[uVar50].lower = (float)local_538._0_4_;
        cv_stack[uVar50].upper = (float)local_538._4_4_;
        uVar50 = (ulong)((int)uVar50 + 1);
        local_a8 = _local_538;
      }
    }
LAB_002f0fb3:
    auVar63 = _local_508;
    if ((int)uVar50 == 0) {
      fVar93 = *(float *)(ray + k * 4 + 0x80);
      auVar125._4_4_ = -(uint)(fVar62 <= fVar93);
      auVar125._0_4_ = -(uint)(fVar150 <= fVar93);
      auVar125._8_4_ = -(uint)(fVar90 <= fVar93);
      auVar125._12_4_ = -(uint)(fVar91 <= fVar93);
      uVar56 = movmskps((int)uVar51,auVar125);
      local_3f0 = (ulong)((uint)local_3f0 & iVar44 + 0xfU & uVar56);
      goto LAB_002f00cb;
    }
    uVar61 = (int)uVar50 - 1;
    uVar51 = (ulong)uVar61;
    uVar60 = mask_stack[uVar51];
    local_538._0_4_ = cv_stack[uVar51].lower;
    local_538._4_4_ = cv_stack[uVar51].upper;
    fStack_530 = 0.0;
    fStack_52c = 0.0;
    uVar11 = 0;
    if (uVar60 != 0) {
      for (; (uVar60 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
      }
    }
    uVar60 = uVar60 - 1 & uVar60;
    mask_stack[uVar51] = uVar60;
    if (uVar60 == 0) {
      uVar50 = (ulong)uVar61;
    }
    fVar167 = (float)(uVar11 + 1) * 0.33333334;
    fVar300 = local_a8._4_4_ * 0.0;
    fVar166 = auVar116._4_4_ * 0.0;
    fVar144 = cu_stack[uVar51].lower;
    fVar149 = cu_stack[uVar51].upper;
    local_518.lower =
         fVar144 * (1.0 - (float)uVar11 * 0.33333334) + fVar149 * (float)uVar11 * 0.33333334;
    local_518.upper = fVar144 * (1.0 - fVar167) + fVar149 * fVar167;
    fVar167 = fVar144 * (0.0 - fVar300) + fVar149 * fVar300;
    fVar149 = fVar144 * (0.0 - fVar166) + fVar149 * fVar166;
    fVar144 = local_518.upper - local_518.lower;
    if (fVar144 < 0.16666667) {
      fVar242 = 1.0 - (float)local_538._0_4_;
      fVar254 = 1.0 - (float)local_538._0_4_;
      fVar188 = 1.0 - (float)local_538._4_4_;
      fVar205 = 1.0 - (float)local_538._4_4_;
      fVar143 = fVar338 * fVar242 + fVar335 * (float)local_538._0_4_;
      fVar183 = fVar343 * fVar254 + fVar291 * (float)local_538._0_4_;
      fVar185 = fVar338 * fVar188 + fVar335 * (float)local_538._4_4_;
      fVar186 = fVar343 * fVar205 + fVar291 * (float)local_538._4_4_;
      fVar300 = fVar348 * fVar242 + fVar314 * (float)local_538._0_4_;
      fVar166 = fVar352 * fVar254 + fVar322 * (float)local_538._0_4_;
      fVar168 = fVar348 * fVar188 + fVar314 * (float)local_538._4_4_;
      fVar142 = fVar352 * fVar205 + fVar322 * (float)local_538._4_4_;
      fVar223 = fVar336 * fVar242 + fVar237 * (float)local_538._0_4_;
      fVar257 = fVar253 * fVar254 + fVar252 * (float)local_538._0_4_;
      fVar260 = fVar336 * fVar188 + fVar237 * (float)local_538._4_4_;
      fVar353 = fVar253 * fVar205 + fVar252 * (float)local_538._4_4_;
      fVar219 = (fVar242 * fVar282 + (float)local_538._0_4_ * fVar141) - fVar223;
      fVar283 = (fVar254 * fVar294 + (float)local_538._0_4_ * fVar140) - fVar257;
      fVar221 = (fVar188 * fVar282 + (float)local_538._4_4_ * fVar141) - fVar260;
      fVar292 = (fVar205 * fVar294 + (float)local_538._4_4_ * fVar140) - fVar353;
      fVar242 = local_518.lower * (fVar223 - fVar300) + fVar300;
      fVar254 = local_518.lower * (fVar257 - fVar166) + fVar166;
      fVar188 = local_518.lower * (fVar260 - fVar168) + fVar168;
      fVar205 = local_518.lower * (fVar353 - fVar142) + fVar142;
      fVar349 = (fVar223 - fVar300) * local_518.upper + fVar300;
      fVar275 = (fVar257 - fVar166) * local_518.upper + fVar166;
      fVar278 = (fVar260 - fVar168) * local_518.upper + fVar168;
      fVar297 = (fVar353 - fVar142) * local_518.upper + fVar142;
      fVar207 = local_518.lower * (fVar300 - fVar143) + fVar143;
      fVar208 = local_518.lower * (fVar166 - fVar183) + fVar183;
      fVar263 = local_518.lower * (fVar168 - fVar185) + fVar185;
      fVar271 = local_518.lower * (fVar142 - fVar186) + fVar186;
      fVar207 = (fVar242 - fVar207) * local_518.lower + fVar207;
      fVar208 = (fVar254 - fVar208) * local_518.lower + fVar208;
      fVar263 = (fVar188 - fVar263) * local_518.lower + fVar263;
      fVar271 = (fVar205 - fVar271) * local_518.lower + fVar271;
      fVar242 = (((local_518.lower * fVar219 + fVar223) - fVar242) * local_518.lower + fVar242) -
                fVar207;
      fVar254 = (((local_518.lower * fVar283 + fVar257) - fVar254) * local_518.lower + fVar254) -
                fVar208;
      fVar188 = (((local_518.lower * fVar221 + fVar260) - fVar188) * local_518.lower + fVar188) -
                fVar263;
      fVar205 = (((local_518.lower * fVar292 + fVar353) - fVar205) * local_518.lower + fVar205) -
                fVar271;
      fVar207 = local_518.lower * fVar242 + fVar207;
      fVar208 = local_518.lower * fVar254 + fVar208;
      fVar263 = local_518.lower * fVar188 + fVar263;
      fVar271 = local_518.lower * fVar205 + fVar271;
      fVar143 = (fVar300 - fVar143) * local_518.upper + fVar143;
      fVar183 = (fVar166 - fVar183) * local_518.upper + fVar183;
      fVar185 = (fVar168 - fVar185) * local_518.upper + fVar185;
      fVar186 = (fVar142 - fVar186) * local_518.upper + fVar186;
      fVar143 = (fVar349 - fVar143) * local_518.upper + fVar143;
      fVar183 = (fVar275 - fVar183) * local_518.upper + fVar183;
      fVar185 = (fVar278 - fVar185) * local_518.upper + fVar185;
      fVar186 = (fVar297 - fVar186) * local_518.upper + fVar186;
      fVar166 = (((fVar219 * local_518.upper + fVar223) - fVar349) * local_518.upper + fVar349) -
                fVar143;
      fVar168 = (((fVar283 * local_518.upper + fVar257) - fVar275) * local_518.upper + fVar275) -
                fVar183;
      fVar142 = (((fVar221 * local_518.upper + fVar260) - fVar278) * local_518.upper + fVar278) -
                fVar185;
      fVar275 = (((fVar292 * local_518.upper + fVar353) - fVar297) * local_518.upper + fVar297) -
                fVar186;
      fVar143 = local_518.upper * fVar166 + fVar143;
      fVar183 = local_518.upper * fVar168 + fVar183;
      fVar185 = local_518.upper * fVar142 + fVar185;
      fVar186 = local_518.upper * fVar275 + fVar186;
      fVar300 = fVar144 * 0.33333334;
      fVar219 = fVar242 * (float)DAT_01f4afa0 * fVar300 + fVar207;
      fVar283 = fVar254 * DAT_01f4afa0._4_4_ * fVar300 + fVar208;
      fVar221 = fVar188 * DAT_01f4afa0._8_4_ * fVar300 + fVar263;
      fVar292 = fVar205 * DAT_01f4afa0._12_4_ * fVar300 + fVar271;
      fVar223 = fVar143 - fVar300 * fVar166 * (float)DAT_01f4afa0;
      fVar349 = fVar183 - fVar300 * fVar168 * DAT_01f4afa0._4_4_;
      fVar257 = fVar185 - fVar300 * fVar142 * DAT_01f4afa0._8_4_;
      fVar275 = fVar186 - fVar300 * fVar275 * DAT_01f4afa0._12_4_;
      auVar19._4_8_ = DAT_01f4afa0._8_8_;
      auVar19._0_4_ = fVar183;
      auVar229._0_8_ = auVar19._0_8_ << 0x20;
      auVar229._8_4_ = fVar185;
      auVar229._12_4_ = fVar186;
      fVar242 = (fVar185 - fVar143) + (fVar263 - fVar207);
      fVar254 = (fVar186 - fVar183) + (fVar271 - fVar208);
      auVar247._0_4_ = fVar349 * fVar254;
      auVar247._4_4_ = fVar349 * fVar254;
      auVar247._8_4_ = fVar275 * fVar254;
      auVar247._12_4_ = fVar275 * fVar254;
      fVar300 = fVar207 * fVar242 + fVar208 * fVar254;
      fVar166 = fVar263 * fVar242 + fVar271 * fVar254;
      fVar188 = fVar219 * fVar242 + fVar283 * fVar254;
      fVar205 = fVar221 * fVar242 + fVar292 * fVar254;
      fVar260 = fVar223 * fVar242 + auVar247._0_4_;
      auVar213._0_8_ = CONCAT44(fVar349 * fVar242 + auVar247._4_4_,fVar260);
      auVar213._8_4_ = fVar257 * fVar242 + auVar247._8_4_;
      auVar213._12_4_ = fVar275 * fVar242 + auVar247._12_4_;
      fVar142 = fVar242 * fVar143 + fVar254 * fVar183;
      fVar278 = fVar242 * fVar185 + fVar254 * fVar186;
      auVar20._4_8_ = auVar247._8_8_;
      auVar20._0_4_ = fVar283 * fVar242 + fVar283 * fVar254;
      auVar248._0_8_ = auVar20._0_8_ << 0x20;
      auVar248._8_4_ = fVar205;
      auVar248._12_4_ = fVar292 * fVar242 + fVar292 * fVar254;
      fVar168 = fVar188;
      if (fVar188 <= fVar300) {
        fVar168 = fVar300;
        fVar300 = fVar188;
      }
      auVar249._8_8_ = auVar248._8_8_;
      auVar249._0_8_ = auVar249._8_8_;
      auVar81._8_4_ = auVar213._8_4_;
      auVar81._0_8_ = auVar213._0_8_;
      auVar81._12_4_ = auVar213._12_4_;
      if (fVar142 <= fVar260) {
        auVar81._0_4_ = fVar142;
      }
      if (auVar81._0_4_ <= fVar300) {
        fVar300 = auVar81._0_4_;
      }
      auVar21._4_8_ = auVar81._8_8_;
      auVar21._0_4_ = fVar242 * fVar183 + fVar254 * fVar183;
      auVar82._0_8_ = auVar21._0_8_ << 0x20;
      auVar82._8_4_ = fVar278;
      auVar82._12_4_ = fVar242 * fVar186 + fVar254 * fVar186;
      if (fVar142 <= fVar260) {
        fVar142 = fVar260;
      }
      local_a8._8_8_ = auVar82._8_8_;
      local_a8._0_8_ = local_a8._8_8_;
      if (fVar142 <= fVar168) {
        fVar142 = fVar168;
      }
      if (fVar205 <= fVar166) {
        auVar249._0_4_ = fVar166;
        fVar166 = fVar205;
      }
      auVar114._8_4_ = auVar213._8_4_;
      auVar114._0_8_ = auVar213._8_8_;
      auVar114._12_4_ = auVar213._12_4_;
      if (fVar278 <= auVar213._8_4_) {
        auVar114._0_4_ = fVar278;
      }
      if (auVar114._0_4_ <= fVar166) {
        fVar166 = auVar114._0_4_;
      }
      if (fVar278 <= auVar213._8_4_) {
        local_a8._0_4_ = auVar213._8_4_;
      }
      if (local_a8._0_4_ <= auVar249._0_4_) {
        local_a8._0_4_ = auVar249._0_4_;
      }
      bVar55 = 3 < (uint)uVar50;
      uVar22 = (undefined3)(uVar61 >> 8);
      uVar51 = (ulong)CONCAT31(uVar22,bVar55);
      fVar168 = local_a8._0_4_;
      if ((0.0001 <= fVar300) || (fVar168 <= -0.0001)) break;
      goto LAB_002f1312;
    }
  } while( true );
  auVar116._0_12_ = ZEXT812(0x38d1b717);
  auVar116._12_4_ = 0;
  if ((fVar166 < 0.0001 && -0.0001 < fVar142) ||
     ((fVar300 < 0.0001 && -0.0001 < fVar142 || (fVar166 < 0.0001 && -0.0001 < fVar168)))) {
LAB_002f1312:
    local_508 = (undefined1  [8])auVar229._8_8_;
    bVar55 = bVar55 || fVar144 < 0.001;
    uVar51 = (ulong)CONCAT31(uVar22,bVar55);
    fVar254 = (float)(~-(uint)(fVar300 < 0.0) & 0x3f800000 | -(uint)(fVar300 < 0.0) & 0xbf800000);
    fVar188 = (float)(~-(uint)(fVar142 < 0.0) & 0x3f800000 | -(uint)(fVar142 < 0.0) & 0xbf800000);
    fVar242 = 0.0;
    if ((fVar254 == fVar188) && (!NAN(fVar254) && !NAN(fVar188))) {
      fVar242 = INFINITY;
    }
    fVar205 = 0.0;
    if ((fVar254 == fVar188) && (!NAN(fVar254) && !NAN(fVar188))) {
      fVar205 = -INFINITY;
    }
    fVar260 = (float)(~-(uint)(fVar166 < 0.0) & 0x3f800000 | -(uint)(fVar166 < 0.0) & 0xbf800000);
    if ((fVar254 != fVar260) || (fVar278 = fVar205, NAN(fVar254) || NAN(fVar260))) {
      if ((fVar166 != fVar300) || (NAN(fVar166) || NAN(fVar300))) {
        fVar166 = -fVar300 / (fVar166 - fVar300);
        fVar166 = (1.0 - fVar166) * 0.0 + fVar166;
        fVar278 = fVar166;
      }
      else {
        fVar166 = 0.0;
        if ((fVar300 != 0.0) || (fVar278 = 1.0, NAN(fVar300))) {
          fVar166 = INFINITY;
          fVar278 = -INFINITY;
        }
      }
      if (fVar166 <= fVar242) {
        fVar242 = fVar166;
      }
      if (fVar278 <= fVar205) {
        fVar278 = fVar205;
      }
    }
    fVar300 = *(float *)(&DAT_01f4bed4 + (ulong)(fVar168 < 0.0) * 4);
    if ((fVar188 != fVar300) || (fVar166 = fVar278, NAN(fVar188) || NAN(fVar300))) {
      if ((fVar168 != fVar142) || (NAN(fVar168) || NAN(fVar142))) {
        fVar254 = -fVar142 / (fVar168 - fVar142);
        fVar254 = (1.0 - fVar254) * 0.0 + fVar254;
        fVar166 = fVar254;
      }
      else {
        fVar254 = 0.0;
        if ((fVar142 != 0.0) || (fVar166 = 1.0, NAN(fVar142))) {
          fVar254 = INFINITY;
          fVar166 = -INFINITY;
        }
      }
      if (fVar254 <= fVar242) {
        fVar242 = fVar254;
      }
      if (fVar166 <= fVar278) {
        fVar166 = fVar278;
      }
    }
    if ((fVar260 != fVar300) || (NAN(fVar260) || NAN(fVar300))) {
      fVar242 = (float)(~-(uint)(fVar242 < 1.0) & 0x3f800000 |
                       (uint)fVar242 & -(uint)(fVar242 < 1.0));
      fVar166 = (float)(~-(uint)(fVar166 < 1.0) & (uint)fVar166 |
                       -(uint)(fVar166 < 1.0) & 0x3f800000);
    }
    auVar115._0_8_ =
         CONCAT44(~-(uint)(fVar166 < 1.0),~-(uint)(fVar242 < 0.0) & (uint)fVar242) &
         0x3f800000ffffffff;
    auVar115._8_8_ = 0;
    auVar116 = auVar115 | ZEXT416((uint)fVar166 & -(uint)(fVar166 < 1.0)) << 0x20;
    fVar300 = auVar116._4_4_;
    local_a8._4_4_ = fVar300;
    local_a8._0_4_ = fVar300;
    local_a8._8_4_ = fVar300;
    local_a8._12_4_ = fVar300;
    if (auVar116._0_4_ <= fVar300) {
      fVar166 = auVar116._0_4_ + -0.1;
      fVar142 = auVar116._8_4_ + 0.0;
      fVar242 = auVar116._12_4_ + 0.0;
      uVar60 = -(uint)(fVar300 + 0.1 < 1.0);
      fVar166 = (float)(~-(uint)(fVar166 < 0.0) & (uint)fVar166);
      fVar300 = (float)(~uVar60 & 0x3f800000 | (uint)(fVar300 + 0.1) & uVar60);
      fVar260 = 1.0 - fVar166;
      fVar278 = 1.0 - fVar166;
      fVar353 = 1.0 - fVar300;
      fVar297 = 1.0 - fVar300;
      fVar254 = fVar207 * fVar260 + fVar263 * fVar166;
      fVar188 = fVar208 * fVar278 + fVar271 * fVar166;
      fVar205 = fVar207 * fVar353 + fVar263 * fVar300;
      fVar207 = fVar208 * fVar297 + fVar271 * fVar300;
      fVar208 = fVar219 * fVar260 + fVar221 * fVar166;
      fVar263 = fVar283 * fVar278 + fVar292 * fVar166;
      fVar271 = fVar219 * fVar353 + fVar221 * fVar300;
      fVar219 = fVar283 * fVar297 + fVar292 * fVar300;
      fVar283 = fVar223 * fVar260 + fVar257 * fVar166;
      fVar221 = fVar349 * fVar278 + fVar275 * fVar166;
      fVar292 = fVar223 * fVar353 + fVar257 * fVar300;
      fVar223 = fVar349 * fVar297 + fVar275 * fVar300;
      fVar185 = fVar260 * fVar143 + fVar185 * fVar166;
      fVar349 = fVar278 * fVar183 + fVar186 * fVar166;
      fVar257 = fVar353 * fVar143 + auVar63._8_4_ * fVar300;
      fVar275 = fVar297 * fVar183 + auVar63._12_4_ * fVar300;
      fVar143 = (float)local_538._4_4_ * fVar142;
      fVar183 = (float)local_538._4_4_ * fVar242;
      fVar260 = (float)local_538._0_4_ * (1.0 - fVar300);
      fStack_530 = (float)local_538._0_4_ * (0.0 - fVar142);
      fStack_52c = (float)local_538._0_4_ * (0.0 - fVar242);
      local_538._0_4_ = (float)local_538._0_4_ * (1.0 - fVar166) + (float)local_538._4_4_ * fVar166;
      local_538._4_4_ = fVar260 + (float)local_538._4_4_ * fVar300;
      fStack_530 = fStack_530 + fVar143;
      fStack_52c = fStack_52c + fVar183;
      fVar144 = 1.0 / fVar144;
      auVar117._0_4_ = fVar257 - fVar185;
      auVar117._4_4_ = fVar275 - fVar349;
      auVar117._8_4_ = fVar257 - fVar257;
      auVar117._12_4_ = fVar275 - fVar275;
      auVar147._0_8_ = CONCAT44(fVar223 - fVar221,fVar292 - fVar283);
      auVar147._8_4_ = fVar292 - fVar292;
      auVar147._12_4_ = fVar223 - fVar223;
      auVar176._0_4_ = fVar271 - fVar208;
      auVar176._4_4_ = fVar219 - fVar263;
      auVar176._8_4_ = fVar271 - fVar271;
      auVar176._12_4_ = fVar219 - fVar219;
      auVar250._0_8_ = CONCAT44((fVar263 - fVar188) * 3.0,(fVar208 - fVar254) * 3.0);
      auVar250._8_4_ = (fVar271 - fVar205) * 3.0;
      auVar250._12_4_ = (fVar219 - fVar207) * 3.0;
      auVar160._0_8_ = CONCAT44((fVar221 - fVar263) * 3.0,(fVar283 - fVar208) * 3.0);
      auVar160._8_4_ = (fVar292 - fVar271) * 3.0;
      auVar160._12_4_ = (fVar223 - fVar219) * 3.0;
      auVar284._0_4_ = (fVar185 - fVar283) * 3.0;
      auVar284._4_4_ = (fVar349 - fVar221) * 3.0;
      auVar284._8_4_ = (fVar257 - fVar292) * 3.0;
      auVar284._12_4_ = (fVar275 - fVar223) * 3.0;
      auVar214._8_4_ = auVar160._8_4_;
      auVar214._0_8_ = auVar160._0_8_;
      auVar214._12_4_ = auVar160._12_4_;
      auVar146 = minps(auVar214,auVar284);
      auVar63 = maxps(auVar160,auVar284);
      auVar266._8_4_ = auVar250._8_4_;
      auVar266._0_8_ = auVar250._0_8_;
      auVar266._12_4_ = auVar250._12_4_;
      auVar133 = minps(auVar266,auVar146);
      auVar110 = maxps(auVar250,auVar63);
      auVar23._4_8_ = auVar63._8_8_;
      auVar23._0_4_ = auVar133._4_4_;
      auVar161._0_8_ = auVar23._0_8_ << 0x20;
      auVar161._8_4_ = auVar133._8_4_;
      auVar161._12_4_ = auVar133._12_4_;
      auVar162._8_8_ = auVar133._8_8_;
      auVar162._0_8_ = auVar161._8_8_;
      auVar24._4_8_ = auVar146._8_8_;
      auVar24._0_4_ = auVar110._4_4_;
      auVar215._0_8_ = auVar24._0_8_ << 0x20;
      auVar215._8_4_ = auVar110._8_4_;
      auVar215._12_4_ = auVar110._12_4_;
      auVar216._8_8_ = auVar110._8_8_;
      auVar216._0_8_ = auVar215._8_8_;
      auVar146 = minps(auVar133,auVar162);
      auVar63 = maxps(auVar110,auVar216);
      fVar260 = auVar146._0_4_ * fVar144;
      fVar278 = auVar146._4_4_ * fVar144;
      fVar353 = auVar146._8_4_ * fVar144;
      fVar297 = auVar146._12_4_ * fVar144;
      fVar208 = fVar144 * auVar63._0_4_;
      fVar271 = fVar144 * auVar63._4_4_;
      fVar283 = fVar144 * auVar63._8_4_;
      fVar144 = fVar144 * auVar63._12_4_;
      fVar257 = 1.0 / ((float)local_538._4_4_ - (float)local_538._0_4_);
      auVar83._0_8_ = CONCAT44(fVar207 - fVar188,fVar205 - fVar254);
      auVar83._8_4_ = fVar205 - fVar205;
      auVar83._12_4_ = fVar207 - fVar207;
      auVar230._8_4_ = auVar83._8_4_;
      auVar230._0_8_ = auVar83._0_8_;
      auVar230._12_4_ = auVar83._12_4_;
      auVar110 = minps(auVar230,auVar176);
      auVar63 = maxps(auVar83,auVar176);
      auVar139._8_4_ = auVar147._8_4_;
      auVar139._0_8_ = auVar147._0_8_;
      auVar139._12_4_ = auVar147._12_4_;
      auVar146 = minps(auVar139,auVar117);
      auVar110 = minps(auVar110,auVar146);
      auVar146 = maxps(auVar147,auVar117);
      auVar63 = maxps(auVar63,auVar146);
      fVar223 = auVar110._0_4_ * fVar257;
      fVar349 = auVar110._4_4_ * fVar257;
      fVar275 = fVar257 * auVar63._0_4_;
      fVar257 = fVar257 * auVar63._4_4_;
      local_508._4_4_ = local_538._0_4_;
      local_508._0_4_ = local_518.lower;
      fStack_500 = local_518.upper;
      fStack_4fc = (float)local_538._4_4_;
      auVar217._4_4_ = local_538._4_4_;
      auVar217._0_4_ = local_518.upper;
      auVar217._8_4_ = fVar167;
      auVar217._12_4_ = fVar149;
      local_b8 = (local_518.lower + local_518.upper) * 0.5;
      fVar188 = ((float)local_538._0_4_ + (float)local_538._4_4_) * 0.5;
      fVar205 = (local_518.upper + fVar167) * 0.0;
      fVar207 = ((float)local_538._4_4_ + fVar149) * 0.0;
      fVar300 = (fVar348 - fVar338) * local_b8 + fVar338;
      fVar166 = (fVar352 - fVar343) * local_b8 + fVar343;
      fVar142 = (fVar314 - fVar335) * local_b8 + p00_1.field_0.v[2];
      fVar143 = (fVar322 - fVar291) * local_b8 + p00_1.field_0.v[3];
      fVar242 = (fVar336 - fVar348) * local_b8 + fVar237;
      fVar183 = (fVar253 - fVar352) * local_b8 + fVar252;
      fVar254 = (fVar237 - fVar314) * local_b8 + fVar314;
      fVar185 = (fVar252 - fVar322) * local_b8 + fVar322;
      fVar300 = (fVar242 - fVar300) * local_b8 + fVar300;
      fVar166 = (fVar183 - fVar166) * local_b8 + fVar166;
      fVar142 = (fVar254 - fVar142) * local_b8 + fVar142;
      fVar143 = (fVar185 - fVar143) * local_b8 + fVar143;
      fVar242 = ((((fVar282 - fVar336) * local_b8 + fVar336) - fVar242) * local_b8 + fVar242) -
                fVar300;
      fVar183 = ((((fVar294 - fVar253) * local_b8 + fVar253) - fVar183) * local_b8 + fVar183) -
                fVar166;
      fVar254 = ((((fVar141 - fVar237) * local_b8 + p02.field_0.v[2]) - fVar254) * local_b8 +
                fVar254) - fVar142;
      fVar185 = ((((fVar140 - fVar252) * local_b8 + p02.field_0.v[3]) - fVar185) * local_b8 +
                fVar185) - fVar143;
      fVar300 = local_b8 * fVar242 + fVar300;
      fVar166 = local_b8 * fVar183 + fVar166;
      fVar242 = fVar242 * 3.0;
      fVar183 = fVar183 * 3.0;
      fVar142 = (local_b8 * fVar254 + fVar142) - fVar300;
      fVar143 = (local_b8 * fVar185 + fVar143) - fVar166;
      fVar242 = (fVar254 * 3.0 - fVar242) * fVar188 + fVar242;
      fVar183 = (fVar185 * 3.0 - fVar183) * fVar188 + fVar183;
      auVar148._0_8_ = CONCAT44(fVar242,fVar142) ^ 0x80000000;
      auVar148._8_4_ = fVar242;
      auVar148._12_4_ = fVar242;
      fVar225 = local_518.lower - local_b8;
      fVar236 = (float)local_538._0_4_ - fVar188;
      fVar355 = local_518.upper - fVar205;
      fVar238 = (float)local_538._4_4_ - fVar207;
      fVar258 = local_518.upper - local_b8;
      fVar239 = (float)local_538._4_4_ - fVar188;
      fVar167 = fVar167 - fVar205;
      fVar149 = fVar149 - fVar207;
      fVar300 = fVar142 * fVar188 + fVar300;
      fVar166 = fVar143 * fVar188 + fVar166;
      auVar163._0_8_ = CONCAT44(fVar183,fVar143) ^ 0x8000000000000000;
      auVar163._8_4_ = -fVar183;
      auVar163._12_4_ = -fVar183;
      auVar84._0_4_ = fVar143 * fVar242 - fVar183 * fVar142;
      auVar84._4_4_ = auVar84._0_4_;
      auVar84._8_4_ = auVar84._0_4_;
      auVar84._12_4_ = auVar84._0_4_;
      auVar146 = divps(auVar163,auVar84);
      auVar63 = divps(auVar148,auVar84);
      fVar205 = auVar146._0_4_;
      fVar207 = auVar146._4_4_;
      fVar254 = auVar63._0_4_;
      fVar185 = auVar63._4_4_;
      local_b8 = local_b8 - (fVar166 * fVar254 + fVar300 * fVar205);
      fVar242 = fVar188 - (fVar166 * fVar185 + fVar300 * fVar207);
      fVar183 = fVar188 - (fVar166 * auVar63._8_4_ + fVar300 * auVar146._8_4_);
      fVar188 = fVar188 - (fVar166 * auVar63._12_4_ + fVar300 * auVar146._12_4_);
      auVar118._0_8_ = CONCAT44(fVar207 * fVar223,fVar207 * fVar260);
      auVar118._8_4_ = fVar207 * fVar278;
      auVar118._12_4_ = fVar207 * fVar349;
      auVar85._0_4_ = fVar207 * fVar208;
      auVar85._4_4_ = fVar207 * fVar275;
      auVar85._8_4_ = fVar207 * fVar271;
      auVar85._12_4_ = fVar207 * fVar257;
      auVar350._8_4_ = auVar118._8_4_;
      auVar350._0_8_ = auVar118._0_8_;
      auVar350._12_4_ = auVar118._12_4_;
      auVar133 = minps(auVar350,auVar85);
      auVar63 = maxps(auVar85,auVar118);
      auVar177._0_8_ = CONCAT44(fVar185 * fVar349,fVar185 * fVar278);
      auVar177._8_4_ = fVar185 * fVar353;
      auVar177._12_4_ = fVar185 * fVar297;
      auVar119._0_4_ = fVar185 * fVar271;
      auVar119._4_4_ = fVar185 * fVar257;
      auVar119._8_4_ = fVar185 * fVar283;
      auVar119._12_4_ = fVar185 * fVar144;
      auVar267._8_4_ = auVar177._8_4_;
      auVar267._0_8_ = auVar177._0_8_;
      auVar267._12_4_ = auVar177._12_4_;
      auVar110 = minps(auVar267,auVar119);
      auVar146 = maxps(auVar119,auVar177);
      fVar300 = 0.0 - (auVar146._0_4_ + auVar63._0_4_);
      fVar166 = 1.0 - (auVar146._4_4_ + auVar63._4_4_);
      fVar142 = 0.0 - (auVar146._8_4_ + auVar63._8_4_);
      fVar143 = 0.0 - (auVar146._12_4_ + auVar63._12_4_);
      fVar263 = 0.0 - (auVar110._0_4_ + auVar133._0_4_);
      fVar219 = 1.0 - (auVar110._4_4_ + auVar133._4_4_);
      fVar221 = 0.0 - (auVar110._8_4_ + auVar133._8_4_);
      fVar292 = 0.0 - (auVar110._12_4_ + auVar133._12_4_);
      auVar120._0_8_ = CONCAT44(fVar236 * fVar166,fVar225 * fVar300);
      auVar120._8_4_ = fVar355 * fVar142;
      auVar120._12_4_ = fVar238 * fVar143;
      auVar285._0_8_ = CONCAT44(fVar223 * fVar205,fVar260 * fVar205);
      auVar285._8_4_ = fVar278 * fVar205;
      auVar285._12_4_ = fVar349 * fVar205;
      auVar178._0_4_ = fVar205 * fVar208;
      auVar178._4_4_ = fVar205 * fVar275;
      auVar178._8_4_ = fVar205 * fVar271;
      auVar178._12_4_ = fVar205 * fVar257;
      auVar268._8_4_ = auVar285._8_4_;
      auVar268._0_8_ = auVar285._0_8_;
      auVar268._12_4_ = auVar285._12_4_;
      auVar146 = minps(auVar268,auVar178);
      auVar63 = maxps(auVar178,auVar285);
      auVar231._0_8_ = CONCAT44(fVar349 * fVar254,fVar278 * fVar254);
      auVar231._8_4_ = fVar353 * fVar254;
      auVar231._12_4_ = fVar297 * fVar254;
      auVar286._0_4_ = fVar254 * fVar271;
      auVar286._4_4_ = fVar254 * fVar257;
      auVar286._8_4_ = fVar254 * fVar283;
      auVar286._12_4_ = fVar254 * fVar144;
      auVar342._8_4_ = auVar231._8_4_;
      auVar342._0_8_ = auVar231._0_8_;
      auVar342._12_4_ = auVar231._12_4_;
      auVar133 = minps(auVar342,auVar286);
      auVar269._0_4_ = fVar225 * fVar263;
      auVar269._4_4_ = fVar236 * fVar219;
      auVar269._8_4_ = fVar355 * fVar221;
      auVar269._12_4_ = fVar238 * fVar292;
      auVar86._0_8_ = CONCAT44(fVar166 * fVar239,fVar300 * fVar258);
      auVar86._8_4_ = fVar142 * fVar167;
      auVar86._12_4_ = fVar143 * fVar149;
      auVar203._0_4_ = fVar263 * fVar258;
      auVar203._4_4_ = fVar219 * fVar239;
      auVar203._8_4_ = fVar221 * fVar167;
      auVar203._12_4_ = fVar292 * fVar149;
      auVar110 = maxps(auVar286,auVar231);
      fVar144 = 1.0 - (auVar110._0_4_ + auVar63._0_4_);
      fVar300 = 0.0 - (auVar110._4_4_ + auVar63._4_4_);
      fVar166 = 0.0 - (auVar110._8_4_ + auVar63._8_4_);
      fVar142 = 0.0 - (auVar110._12_4_ + auVar63._12_4_);
      fVar143 = 1.0 - (auVar133._0_4_ + auVar146._0_4_);
      fVar208 = 0.0 - (auVar133._4_4_ + auVar146._4_4_);
      fVar263 = 0.0 - (auVar133._8_4_ + auVar146._8_4_);
      fVar271 = 0.0 - (auVar133._12_4_ + auVar146._12_4_);
      auVar232._0_8_ = CONCAT44(fVar236 * fVar300,fVar225 * fVar144);
      auVar232._8_4_ = fVar355 * fVar166;
      auVar232._12_4_ = fVar238 * fVar142;
      auVar312._0_4_ = fVar225 * fVar143;
      auVar312._4_4_ = fVar236 * fVar208;
      auVar312._8_4_ = fVar355 * fVar263;
      auVar312._12_4_ = fVar238 * fVar271;
      auVar179._0_8_ = CONCAT44(fVar300 * fVar239,fVar144 * fVar258);
      auVar179._8_4_ = fVar166 * fVar167;
      auVar179._12_4_ = fVar142 * fVar149;
      auVar251._0_4_ = fVar143 * fVar258;
      auVar251._4_4_ = fVar208 * fVar239;
      auVar251._8_4_ = fVar263 * fVar167;
      auVar251._12_4_ = fVar271 * fVar149;
      auVar287._8_4_ = auVar232._8_4_;
      auVar287._0_8_ = auVar232._0_8_;
      auVar287._12_4_ = auVar232._12_4_;
      auVar63 = minps(auVar287,auVar312);
      auVar331._8_4_ = auVar179._8_4_;
      auVar331._0_8_ = auVar179._0_8_;
      auVar331._12_4_ = auVar179._12_4_;
      auVar146 = minps(auVar331,auVar251);
      auVar246 = minps(auVar63,auVar146);
      auVar146 = maxps(auVar312,auVar232);
      auVar63 = maxps(auVar251,auVar179);
      auVar110 = maxps(auVar63,auVar146);
      auVar233._8_4_ = auVar120._8_4_;
      auVar233._0_8_ = auVar120._0_8_;
      auVar233._12_4_ = auVar120._12_4_;
      auVar146 = minps(auVar233,auVar269);
      auVar180._8_4_ = auVar86._8_4_;
      auVar180._0_8_ = auVar86._0_8_;
      auVar180._12_4_ = auVar86._12_4_;
      auVar63 = minps(auVar180,auVar203);
      auVar146 = minps(auVar146,auVar63);
      auVar133 = maxps(auVar269,auVar120);
      auVar63 = maxps(auVar203,auVar86);
      auVar63 = maxps(auVar63,auVar133);
      auVar234._0_4_ = auVar246._4_4_ + auVar246._0_4_ + local_b8;
      auVar234._4_4_ = auVar146._4_4_ + auVar146._0_4_ + fVar242;
      auVar234._8_4_ = auVar246._8_4_ + auVar246._4_4_ + fVar183;
      auVar234._12_4_ = auVar246._12_4_ + auVar146._4_4_ + fVar188;
      fVar144 = auVar110._4_4_ + auVar110._0_4_ + local_b8;
      fVar149 = auVar63._4_4_ + auVar63._0_4_ + fVar242;
      auVar87._4_4_ = fVar149;
      auVar87._0_4_ = fVar144;
      auVar116 = maxps(_local_508,auVar234);
      auVar87._8_4_ = auVar110._8_4_ + auVar110._4_4_ + fVar183;
      auVar87._12_4_ = auVar110._12_4_ + auVar63._4_4_ + fVar188;
      auVar63 = minps(auVar87,auVar217);
      iVar57 = -(uint)(auVar63._0_4_ < auVar116._0_4_);
      iVar59 = -(uint)(auVar63._4_4_ < auVar116._4_4_);
      auVar88._4_4_ = iVar59;
      auVar88._0_4_ = iVar57;
      auVar88._8_4_ = iVar59;
      auVar88._12_4_ = iVar59;
      local_a8._8_8_ = auVar88._8_8_;
      local_a8._4_4_ = (float)iVar57;
      local_a8._0_4_ = (float)iVar57;
      iVar57 = movmskpd((uint)(fVar168 < 0.0),local_a8);
      if (iVar57 == 0) {
        bVar49 = 0;
        if ((local_518.lower < auVar234._0_4_) && (fVar144 < local_518.upper)) {
          bVar49 = -(fVar149 < (float)local_538._4_4_) & (float)local_538._0_4_ < auVar234._4_4_;
        }
        bVar49 = bVar55 | bVar49;
        uVar51 = (ulong)CONCAT31(uVar22,bVar49);
        if (bVar49 != 1) goto LAB_002f0951;
        uVar51 = 0xc9;
        do {
          uVar51 = uVar51 - 1;
          if (uVar51 == 0) goto LAB_002f0fb3;
          fVar149 = 1.0 - local_b8;
          fVar168 = local_b8 * local_b8 * local_b8;
          fVar166 = local_b8 * local_b8 * 3.0 * fVar149;
          fVar144 = fVar149 * fVar149 * fVar149;
          fVar142 = local_b8 * 3.0 * fVar149 * fVar149;
          fVar149 = fVar144 * fVar338 + fVar142 * fVar237 + fVar166 * fVar336 + fVar168 * fVar282;
          fVar167 = fVar144 * fVar343 + fVar142 * fVar252 + fVar166 * fVar253 + fVar168 * fVar294;
          fVar300 = fVar144 * p00_1.field_0.v[2] +
                    fVar142 * fVar314 + fVar166 * p02.field_0.v[2] + fVar168 * fVar141;
          fVar166 = fVar144 * p00_1.field_0.v[3] +
                    fVar142 * fVar322 + fVar166 * p02.field_0.v[3] + fVar168 * fVar140;
          fVar168 = (fVar300 - fVar149) * fVar242;
          fVar142 = (fVar166 - fVar167) * fVar242;
          fVar144 = (fVar300 - fVar149) * fVar242 + fVar149;
          fVar300 = (fVar166 - fVar167) * fVar242 + fVar167;
          local_b8 = local_b8 - (fVar300 * fVar254 + fVar144 * fVar205);
          fVar242 = fVar242 - (fVar300 * fVar185 + fVar144 * fVar207);
          fVar166 = ABS(fVar300);
          local_a8._0_8_ = CONCAT44(fVar300,fVar144) & 0x7fffffff7fffffff;
          local_a8._8_4_ = ABS(fVar168 + fVar149);
          local_a8._12_4_ = ABS(fVar142 + fVar167);
          auVar116._0_8_ = CONCAT44(fVar300,fVar300) & 0x7fffffff7fffffff;
          auVar116._8_4_ = (int)fVar166;
          auVar116._12_4_ = (int)fVar166;
          if (fVar166 <= ABS(fVar144)) {
            auVar116._0_4_ = ABS(fVar144);
          }
        } while (fVar129 <= auVar116._0_4_);
        if ((((0.0 <= local_b8) && (local_b8 <= 1.0)) &&
            (local_a8._4_4_ = fVar242, local_a8._0_4_ = fVar242, local_a8._8_4_ = fVar242,
            local_a8._12_4_ = fVar242, 0.0 <= fVar242)) && (fVar242 <= 1.0)) {
          fVar144 = pre->ray_space[k].vx.field_0.m128[2];
          fVar149 = pre->ray_space[k].vy.field_0.m128[2];
          fVar167 = pre->ray_space[k].vz.field_0.m128[2];
          auVar121._0_4_ = fVar255 * fVar144;
          auVar121._4_4_ = fVar262 * fVar149;
          auVar121._8_4_ = fVar270 * fVar167;
          auVar121._12_4_ = (fVar274 - 0.0) * 0.0;
          auVar122._8_8_ = auVar121._8_8_;
          auVar122._0_8_ = auVar122._8_8_;
          auVar116._4_12_ = auVar122._4_12_;
          fVar183 = 1.0 - fVar242;
          fVar143 = 1.0 - local_b8;
          fVar300 = fVar143 * fVar143 * fVar143;
          fVar166 = local_b8 * 3.0 * fVar143 * fVar143;
          fVar142 = local_b8 * local_b8 * local_b8;
          fVar168 = local_b8 * local_b8 * 3.0 * fVar143;
          auVar116._0_4_ =
               ((auVar121._8_4_ + auVar121._4_4_ + auVar121._0_4_) * fVar183 +
               (fVar296 * fVar167 + fVar337 * fVar149 + fVar333 * fVar144) * fVar242) * fVar300 +
               ((fVar354 * fVar167 + fVar351 * fVar149 + fVar347 * fVar144) * fVar183 +
               (fVar326 * fVar167 + fVar318 * fVar149 + fVar303 * fVar144) * fVar242) * fVar166 +
               ((fVar259 * fVar167 + fVar241 * fVar149 + fVar334 * fVar144) * fVar183 +
               (fVar325 * fVar167 + fVar240 * fVar149 + fVar235 * fVar144) * fVar242) * fVar168 +
               (fVar183 * (fVar298 * fVar167 + fVar290 * fVar149 + fVar281 * fVar144) +
               (fVar167 * fVar128 + fVar149 * fVar127 + fVar144 * fVar93) * fVar242) * fVar142;
          if ((fVar186 <= auVar116._0_4_) &&
             (fVar144 = *(float *)(ray + k * 4 + 0x80), auVar116._0_4_ <= fVar144)) {
            fVar185 = 1.0 - fVar242;
            fVar186 = 1.0 - fVar242;
            fVar188 = 1.0 - fVar242;
            fVar205 = 1.0 - fVar242;
            fVar149 = fVar220 * fVar185 + fVar304 * fVar242;
            fVar167 = fVar164 * fVar186 + fVar315 * fVar242;
            fVar183 = fVar187 * fVar188 + fVar319 * fVar242;
            fVar254 = fVar206 * fVar205 + fVar323 * fVar242;
            fVar207 = fVar302 * fVar185 + fVar182 * fVar242;
            fVar263 = fVar313 * fVar186 + fVar184 * fVar242;
            fVar219 = fVar317 * fVar188 + fVar224 * fVar242;
            fVar221 = fVar321 * fVar205 + fVar209 * fVar242;
            fVar208 = fVar207 - fVar149;
            fVar271 = fVar263 - fVar167;
            fVar283 = fVar219 - fVar183;
            fVar292 = fVar221 - fVar254;
            fVar149 = (((fVar149 - (fVar332 * fVar185 + fVar218 * fVar242)) * fVar143 +
                       local_b8 * fVar208) * fVar143 +
                      (fVar208 * fVar143 +
                      ((fVar185 * fVar277 + fVar273 * fVar242) - fVar207) * local_b8) * local_b8) *
                      3.0;
            fVar167 = (((fVar167 - (fVar222 * fVar186 + fVar151 * fVar242)) * fVar143 +
                       local_b8 * fVar271) * fVar143 +
                      (fVar271 * fVar143 +
                      ((fVar186 * fVar289 + fVar280 * fVar242) - fVar263) * local_b8) * local_b8) *
                      3.0;
            fVar183 = (((fVar183 - (fVar256 * fVar188 + fVar165 * fVar242)) * fVar143 +
                       local_b8 * fVar283) * fVar143 +
                      (fVar283 * fVar143 +
                      ((fVar188 * fVar295 + fVar288 * fVar242) - fVar219) * local_b8) * local_b8) *
                      3.0;
            fVar143 = (((fVar254 - (fVar274 * fVar205 + fVar204 * fVar242)) * fVar143 +
                       local_b8 * fVar292) * fVar143 +
                      (fVar292 * fVar143 +
                      ((fVar205 * fVar299 + fVar293 * fVar242) - fVar221) * local_b8) * local_b8) *
                      3.0;
            pGVar7 = (context->scene->geometries).items[uVar56].ptr;
            uVar51 = (ulong)*(uint *)(ray + k * 4 + 0x90);
            if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              fVar254 = fVar300 * (fVar218 - fVar332) +
                        fVar166 * (fVar304 - fVar220) +
                        fVar168 * (fVar182 - fVar302) + fVar142 * (fVar273 - fVar277);
              fVar185 = fVar300 * (fVar151 - fVar222) +
                        fVar166 * (fVar315 - fVar164) +
                        fVar168 * (fVar184 - fVar313) + fVar142 * (fVar280 - fVar289);
              fVar186 = fVar300 * (fVar165 - fVar256) +
                        fVar166 * (fVar319 - fVar187) +
                        fVar168 * (fVar224 - fVar317) + fVar142 * (fVar288 - fVar295);
              fVar300 = fVar300 * (fVar204 - fVar274) +
                        fVar166 * (fVar323 - fVar206) +
                        fVar168 * (fVar209 - fVar321) + fVar142 * (fVar293 - fVar299);
              auVar181._0_4_ = fVar185 * fVar149 - fVar167 * fVar254;
              auVar181._4_4_ = fVar186 * fVar167 - fVar183 * fVar185;
              auVar181._8_4_ = fVar254 * fVar183 - fVar149 * fVar186;
              auVar181._12_4_ = fVar300 * fVar143 - fVar143 * fVar300;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                *(float *)(ray + k * 4 + 0x80) = auVar116._0_4_;
                *(float *)(ray + k * 4 + 0xc0) = auVar181._4_4_;
                auVar25._4_8_ = auVar122._8_8_;
                auVar25._0_4_ = auVar181._4_4_;
                auVar123._0_8_ = auVar25._0_8_ << 0x20;
                auVar123._8_4_ = auVar181._8_4_;
                auVar123._12_4_ = auVar181._12_4_;
                auVar116._8_8_ = auVar181._8_8_;
                auVar116._0_8_ = auVar123._8_8_;
                *(float *)(ray + k * 4 + 0xd0) = auVar181._8_4_;
                *(float *)(ray + k * 4 + 0xe0) = auVar181._0_4_;
                *(float *)(ray + k * 4 + 0xf0) = local_b8;
                *(float *)(ray + k * 4 + 0x100) = fVar242;
                *(int *)(ray + k * 4 + 0x110) = (int)local_3f8;
                *(uint *)(ray + k * 4 + 0x120) = uVar56;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                uVar60 = context->user->instPrimID[0];
                uVar51 = (ulong)uVar60;
                *(uint *)(ray + k * 4 + 0x140) = uVar60;
              }
              else {
                local_e8 = auVar181._4_4_;
                fStack_e4 = auVar181._4_4_;
                fStack_e0 = auVar181._4_4_;
                fStack_dc = auVar181._4_4_;
                local_d8 = auVar181._8_4_;
                fStack_d4 = auVar181._8_4_;
                fStack_d0 = auVar181._8_4_;
                fStack_cc = auVar181._8_4_;
                local_c8 = auVar181._0_4_;
                fStack_c4 = auVar181._0_4_;
                fStack_c0 = auVar181._0_4_;
                fStack_bc = auVar181._0_4_;
                fStack_b4 = local_b8;
                fStack_b0 = local_b8;
                fStack_ac = local_b8;
                local_98 = CONCAT44(uVar58,uVar58);
                uStack_90 = CONCAT44(uVar58,uVar58);
                local_88 = CONCAT44(uVar56,uVar56);
                uStack_80 = CONCAT44(uVar56,uVar56);
                local_78 = context->user->instID[0];
                uStack_74 = local_78;
                uStack_70 = local_78;
                uStack_6c = local_78;
                local_68 = context->user->instPrimID[0];
                uStack_64 = local_68;
                uStack_60 = local_68;
                uStack_5c = local_68;
                *(float *)(ray + k * 4 + 0x80) = auVar116._0_4_;
                local_418 = *local_408;
                args.valid = (int *)local_418;
                args.geometryUserPtr = pGVar7->userPtr;
                args.context = context->user;
                args.hit = (RTCHitN *)&local_e8;
                args.N = 4;
                p_Var52 = pGVar7->intersectionFilterN;
                args.ray = (RTCRayN *)ray;
                if (p_Var52 != (RTCFilterFunctionN)0x0) {
                  p_Var52 = (RTCFilterFunctionN)(*p_Var52)(&args);
                }
                auVar124._0_4_ = -(uint)(local_418._0_4_ == 0);
                auVar124._4_4_ = -(uint)(local_418._4_4_ == 0);
                auVar124._8_4_ = -(uint)(local_418._8_4_ == 0);
                auVar124._12_4_ = -(uint)(local_418._12_4_ == 0);
                uVar60 = movmskps((int)p_Var52,auVar124);
                pRVar53 = (RTCRayN *)(ulong)(uVar60 ^ 0xf);
                if ((uVar60 ^ 0xf) == 0) {
                  auVar124 = auVar124 ^ _DAT_01f46b70;
                }
                else {
                  p_Var52 = context->args->filter;
                  auVar63 = local_418;
                  if ((p_Var52 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    p_Var52 = (RTCFilterFunctionN)(*p_Var52)(&args);
                    auVar63 = local_418;
                  }
                  local_418._0_4_ = -(uint)(auVar63._0_4_ == 0);
                  local_418._4_4_ = -(uint)(auVar63._4_4_ == 0);
                  local_418._8_4_ = -(uint)(auVar63._8_4_ == 0);
                  local_418._12_4_ = -(uint)(auVar63._12_4_ == 0);
                  auVar124 = local_418 ^ _DAT_01f46b70;
                  uVar60 = movmskps((int)p_Var52,local_418);
                  pRVar53 = (RTCRayN *)(ulong)(uVar60 ^ 0xf);
                  if ((uVar60 ^ 0xf) != 0) {
                    uVar60 = *(uint *)(args.hit + 4);
                    uVar61 = *(uint *)(args.hit + 8);
                    uVar27 = *(uint *)(args.hit + 0xc);
                    *(uint *)(args.ray + 0xc0) =
                         ~local_418._0_4_ & *(uint *)args.hit |
                         *(uint *)(args.ray + 0xc0) & local_418._0_4_;
                    *(uint *)(args.ray + 0xc4) =
                         ~local_418._4_4_ & uVar60 | *(uint *)(args.ray + 0xc4) & local_418._4_4_;
                    *(uint *)(args.ray + 200) =
                         ~local_418._8_4_ & uVar61 | *(uint *)(args.ray + 200) & local_418._8_4_;
                    *(uint *)(args.ray + 0xcc) =
                         ~local_418._12_4_ & uVar27 | *(uint *)(args.ray + 0xcc) & local_418._12_4_;
                    uVar60 = *(uint *)(args.hit + 0x14);
                    uVar61 = *(uint *)(args.hit + 0x18);
                    uVar27 = *(uint *)(args.hit + 0x1c);
                    *(uint *)(args.ray + 0xd0) =
                         ~local_418._0_4_ & *(uint *)(args.hit + 0x10) |
                         *(uint *)(args.ray + 0xd0) & local_418._0_4_;
                    *(uint *)(args.ray + 0xd4) =
                         ~local_418._4_4_ & uVar60 | *(uint *)(args.ray + 0xd4) & local_418._4_4_;
                    *(uint *)(args.ray + 0xd8) =
                         ~local_418._8_4_ & uVar61 | *(uint *)(args.ray + 0xd8) & local_418._8_4_;
                    *(uint *)(args.ray + 0xdc) =
                         ~local_418._12_4_ & uVar27 | *(uint *)(args.ray + 0xdc) & local_418._12_4_;
                    uVar60 = *(uint *)(args.hit + 0x24);
                    uVar61 = *(uint *)(args.hit + 0x28);
                    uVar27 = *(uint *)(args.hit + 0x2c);
                    *(uint *)(args.ray + 0xe0) =
                         ~local_418._0_4_ & *(uint *)(args.hit + 0x20) |
                         *(uint *)(args.ray + 0xe0) & local_418._0_4_;
                    *(uint *)(args.ray + 0xe4) =
                         ~local_418._4_4_ & uVar60 | *(uint *)(args.ray + 0xe4) & local_418._4_4_;
                    *(uint *)(args.ray + 0xe8) =
                         ~local_418._8_4_ & uVar61 | *(uint *)(args.ray + 0xe8) & local_418._8_4_;
                    *(uint *)(args.ray + 0xec) =
                         ~local_418._12_4_ & uVar27 | *(uint *)(args.ray + 0xec) & local_418._12_4_;
                    uVar60 = *(uint *)(args.hit + 0x34);
                    uVar61 = *(uint *)(args.hit + 0x38);
                    uVar27 = *(uint *)(args.hit + 0x3c);
                    *(uint *)(args.ray + 0xf0) =
                         ~local_418._0_4_ & *(uint *)(args.hit + 0x30) |
                         *(uint *)(args.ray + 0xf0) & local_418._0_4_;
                    *(uint *)(args.ray + 0xf4) =
                         ~local_418._4_4_ & uVar60 | *(uint *)(args.ray + 0xf4) & local_418._4_4_;
                    *(uint *)(args.ray + 0xf8) =
                         ~local_418._8_4_ & uVar61 | *(uint *)(args.ray + 0xf8) & local_418._8_4_;
                    *(uint *)(args.ray + 0xfc) =
                         ~local_418._12_4_ & uVar27 | *(uint *)(args.ray + 0xfc) & local_418._12_4_;
                    uVar60 = *(uint *)(args.hit + 0x44);
                    uVar61 = *(uint *)(args.hit + 0x48);
                    uVar27 = *(uint *)(args.hit + 0x4c);
                    *(uint *)(args.ray + 0x100) =
                         ~local_418._0_4_ & *(uint *)(args.hit + 0x40) |
                         *(uint *)(args.ray + 0x100) & local_418._0_4_;
                    *(uint *)(args.ray + 0x104) =
                         ~local_418._4_4_ & uVar60 | *(uint *)(args.ray + 0x104) & local_418._4_4_;
                    *(uint *)(args.ray + 0x108) =
                         ~local_418._8_4_ & uVar61 | *(uint *)(args.ray + 0x108) & local_418._8_4_;
                    *(uint *)(args.ray + 0x10c) =
                         ~local_418._12_4_ & uVar27 | *(uint *)(args.ray + 0x10c) & local_418._12_4_
                    ;
                    uVar60 = *(uint *)(args.hit + 0x54);
                    uVar61 = *(uint *)(args.hit + 0x58);
                    uVar27 = *(uint *)(args.hit + 0x5c);
                    *(uint *)(args.ray + 0x110) =
                         *(uint *)(args.ray + 0x110) & local_418._0_4_ |
                         ~local_418._0_4_ & *(uint *)(args.hit + 0x50);
                    *(uint *)(args.ray + 0x114) =
                         *(uint *)(args.ray + 0x114) & local_418._4_4_ | ~local_418._4_4_ & uVar60;
                    *(uint *)(args.ray + 0x118) =
                         *(uint *)(args.ray + 0x118) & local_418._8_4_ | ~local_418._8_4_ & uVar61;
                    *(uint *)(args.ray + 0x11c) =
                         *(uint *)(args.ray + 0x11c) & local_418._12_4_ | ~local_418._12_4_ & uVar27
                    ;
                    uVar60 = *(uint *)(args.hit + 100);
                    uVar61 = *(uint *)(args.hit + 0x68);
                    uVar27 = *(uint *)(args.hit + 0x6c);
                    *(uint *)(args.ray + 0x120) =
                         *(uint *)(args.ray + 0x120) & local_418._0_4_ |
                         ~local_418._0_4_ & *(uint *)(args.hit + 0x60);
                    *(uint *)(args.ray + 0x124) =
                         *(uint *)(args.ray + 0x124) & local_418._4_4_ | ~local_418._4_4_ & uVar60;
                    *(uint *)(args.ray + 0x128) =
                         *(uint *)(args.ray + 0x128) & local_418._8_4_ | ~local_418._8_4_ & uVar61;
                    *(uint *)(args.ray + 300) =
                         *(uint *)(args.ray + 300) & local_418._12_4_ | ~local_418._12_4_ & uVar27;
                    uVar60 = *(uint *)(args.hit + 0x74);
                    uVar61 = *(uint *)(args.hit + 0x78);
                    uVar27 = *(uint *)(args.hit + 0x7c);
                    *(uint *)(args.ray + 0x130) =
                         ~local_418._0_4_ & *(uint *)(args.hit + 0x70) |
                         *(uint *)(args.ray + 0x130) & local_418._0_4_;
                    *(uint *)(args.ray + 0x134) =
                         ~local_418._4_4_ & uVar60 | *(uint *)(args.ray + 0x134) & local_418._4_4_;
                    *(uint *)(args.ray + 0x138) =
                         ~local_418._8_4_ & uVar61 | *(uint *)(args.ray + 0x138) & local_418._8_4_;
                    *(uint *)(args.ray + 0x13c) =
                         ~local_418._12_4_ & uVar27 | *(uint *)(args.ray + 0x13c) & local_418._12_4_
                    ;
                    local_418 = ~local_418 & *(undefined1 (*) [16])(args.hit + 0x80) |
                                *(undefined1 (*) [16])(args.ray + 0x140) & local_418;
                    *(undefined1 (*) [16])(args.ray + 0x140) = local_418;
                    pRVar53 = args.ray;
                  }
                }
                auVar116._0_4_ = (float)(auVar124._0_4_ << 0x1f);
                auVar116._4_4_ = auVar124._4_4_ << 0x1f;
                auVar116._8_4_ = auVar124._8_4_ << 0x1f;
                auVar116._12_4_ = auVar124._12_4_ << 0x1f;
                uVar60 = movmskps((int)pRVar53,auVar116);
                uVar51 = (ulong)uVar60;
                local_a8 = local_418;
                if (uVar60 == 0) {
                  *(float *)(ray + k * 4 + 0x80) = fVar144;
                }
              }
            }
          }
        }
      }
    }
  }
  goto LAB_002f0fb3;
}

Assistant:

static __forceinline void intersect_hn(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }